

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  _func_int ***ppp_Var1;
  float *pfVar2;
  _func_int ***ppp_Var3;
  float *pfVar4;
  _func_int ***ppp_Var5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [12];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined6 uVar61;
  undefined1 auVar62 [12];
  unkbyte9 Var63;
  undefined1 auVar64 [13];
  undefined1 auVar65 [12];
  undefined1 auVar66 [13];
  undefined1 auVar67 [12];
  undefined1 auVar68 [13];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [13];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  bool bVar89;
  bool bVar90;
  bool bVar91;
  bool bVar92;
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [13];
  undefined1 auVar118 [13];
  undefined1 auVar119 [13];
  undefined1 auVar120 [13];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [16];
  ulong uVar126;
  RTCFilterFunctionN p_Var127;
  RTCRayN *pRVar128;
  RTCIntersectArguments *pRVar129;
  ulong uVar130;
  long lVar131;
  RTCIntersectArguments *pRVar132;
  Geometry *pGVar133;
  long lVar134;
  undefined4 uVar135;
  long lVar137;
  long lVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  short sVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar150 [12];
  float fVar211;
  undefined1 auVar155 [16];
  char cVar218;
  undefined1 auVar158 [16];
  undefined1 auVar151 [12];
  undefined1 auVar162 [16];
  undefined1 auVar152 [12];
  undefined1 auVar166 [16];
  undefined1 auVar153 [12];
  undefined1 auVar170 [16];
  float fVar216;
  float fVar219;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar154 [12];
  undefined1 auVar180 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  float fVar217;
  float fVar220;
  undefined8 uVar221;
  float fVar222;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar201;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar202;
  undefined1 auVar203 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar204;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar205;
  undefined1 auVar206 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar207;
  undefined1 auVar208 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar209;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar268;
  float fVar271;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  int iVar276;
  char cVar307;
  undefined1 uVar308;
  int iVar309;
  vfloat4 v;
  int iVar277;
  int iVar278;
  undefined1 auVar282 [16];
  char cVar310;
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar294 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar311;
  float fVar322;
  float fVar324;
  undefined1 auVar312 [16];
  float fVar323;
  float fVar325;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar326;
  float fVar327;
  float fVar338;
  float fVar339;
  float fVar341;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar340;
  float fVar342;
  float fVar343;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar344;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  char cVar352;
  float fVar345;
  float fVar353;
  float fVar354;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar355;
  float fVar356;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar366;
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar368 [16];
  float fVar375;
  float fVar376;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  float fVar387;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  float fVar390;
  float fVar391;
  float fVar394;
  float fVar396;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar392;
  float fVar395;
  float fVar397;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar393;
  float fVar401;
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  float fVar402;
  float fVar409;
  float fVar410;
  float fVar411;
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar407;
  undefined1 auVar408 [16];
  float fVar412;
  float fVar413;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  float fVar424;
  float fVar425;
  float fVar429;
  float fVar430;
  float fVar431;
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 local_518 [8];
  float fStack_510;
  undefined4 uStack_50c;
  char local_4f8;
  char cStack_4f7;
  undefined1 uStack_4f6;
  undefined1 uStack_4f5;
  undefined2 local_4e8;
  undefined2 uStack_4e6;
  undefined2 uStack_4e4;
  undefined2 uStack_4e2;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  char local_498;
  char cStack_497;
  undefined1 uStack_496;
  undefined1 uStack_495;
  undefined4 local_488;
  undefined2 uStack_484;
  undefined2 uStack_482;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  vbool<4> valid;
  undefined1 local_3f8 [16];
  RTCIntersectArguments *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  RTCFilterFunctionNArguments args;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_4> bhit;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar136;
  undefined1 auVar149 [12];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined2 uVar210;
  int iVar212;
  int iVar213;
  int iVar214;
  int iVar215;
  undefined1 auVar228 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar279 [12];
  undefined1 auVar280 [12];
  undefined1 auVar281 [12];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar295 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar296 [16];
  
  PVar20 = prim[1];
  uVar126 = (ulong)(byte)PVar20;
  lVar131 = uVar126 * 0x25;
  uVar135 = *(undefined4 *)(prim + uVar126 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar126 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar126 * 6 + 6);
  uVar9 = *(undefined4 *)(prim + uVar126 * 0xf + 6);
  uVar23 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar24 = *(undefined4 *)(prim + uVar126 * 0x11 + 6);
  uVar10 = *(undefined4 *)(prim + uVar126 * 0x1a + 6);
  uVar11 = *(undefined4 *)(prim + uVar126 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar126 * 0x1c + 6);
  pPVar7 = prim + lVar131 + 6;
  fVar421 = *(float *)(pPVar7 + 0xc);
  fVar223 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar421;
  fVar268 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar421;
  fVar271 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar421;
  fVar412 = *(float *)(ray + k * 4 + 0x40) * fVar421;
  fVar419 = *(float *)(ray + k * 4 + 0x50) * fVar421;
  fVar421 = *(float *)(ray + k * 4 + 0x60) * fVar421;
  uVar308 = (undefined1)((uint)uVar21 >> 0x18);
  uVar210 = CONCAT11(uVar308,uVar308);
  uVar308 = (undefined1)((uint)uVar21 >> 0x10);
  uVar221 = CONCAT35(CONCAT21(uVar210,uVar308),CONCAT14(uVar308,uVar21));
  cVar307 = (char)((uint)uVar21 >> 8);
  uVar61 = CONCAT51(CONCAT41((int)((ulong)uVar221 >> 0x20),cVar307),cVar307);
  cVar218 = (char)uVar21;
  uVar136 = CONCAT62(uVar61,CONCAT11(cVar218,cVar218));
  auVar284._8_4_ = 0;
  auVar284._0_8_ = uVar136;
  auVar284._12_2_ = uVar210;
  auVar284._14_2_ = uVar210;
  uVar210 = (undefined2)((ulong)uVar221 >> 0x20);
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._8_2_ = 0;
  auVar283._0_8_ = uVar136;
  auVar283._10_2_ = uVar210;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._8_2_ = uVar210;
  auVar282._0_8_ = uVar136;
  uVar210 = (undefined2)uVar61;
  auVar62._4_8_ = auVar282._8_8_;
  auVar62._2_2_ = uVar210;
  auVar62._0_2_ = uVar210;
  iVar276 = (int)CONCAT11(cVar218,cVar218) >> 8;
  iVar309 = auVar62._0_4_ >> 0x18;
  auVar279._0_8_ = CONCAT44(iVar309,iVar276);
  auVar279._8_4_ = auVar282._8_4_ >> 0x18;
  auVar285._12_4_ = auVar283._12_4_ >> 0x18;
  auVar285._0_12_ = auVar279;
  fVar401 = (float)iVar309;
  cVar310 = cVar307 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar285._0_13_;
  auVar29[0xe] = cVar310;
  auVar33[0xc] = cVar310;
  auVar33._0_12_ = auVar279;
  auVar33._13_2_ = auVar29._13_2_;
  auVar37[0xb] = 0;
  auVar37._0_11_ = auVar279._0_11_;
  auVar37._12_3_ = auVar33._12_3_;
  auVar41[10] = cVar310;
  auVar41._0_10_ = auVar279._0_10_;
  auVar41._11_4_ = auVar37._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar279._0_9_;
  auVar45._10_5_ = auVar41._10_5_;
  auVar49[8] = cVar307;
  auVar49._0_8_ = auVar279._0_8_;
  auVar49._9_6_ = auVar45._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar49._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar218 >> 7);
  auVar53._6_9_ = Var63;
  auVar53[5] = (char)((uint)uVar22 >> 0x10);
  auVar53[4] = (undefined1)((short)cVar218 >> 7);
  auVar53._0_4_ = iVar276;
  cVar310 = (char)((uint)uVar22 >> 8);
  auVar64._2_11_ = auVar53._4_11_;
  auVar64[1] = cVar310;
  auVar64[0] = (undefined1)((short)cVar218 >> 7);
  cVar307 = (char)uVar22;
  auVar57._2_13_ = auVar64;
  auVar57._0_2_ = CONCAT11(cVar307,cVar218);
  uVar210 = (undefined2)Var63;
  auVar288._0_12_ = auVar57._0_12_;
  auVar288._12_2_ = uVar210;
  auVar288._14_2_ = uVar210;
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._0_10_ = auVar57._0_10_;
  auVar287._10_2_ = auVar53._4_2_;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._0_8_ = auVar57._0_8_;
  auVar286._8_2_ = auVar53._4_2_;
  auVar65._4_8_ = auVar286._8_8_;
  auVar65._2_2_ = auVar64._0_2_;
  auVar65._0_2_ = auVar64._0_2_;
  iVar277 = (int)CONCAT11(cVar307,cVar218) >> 8;
  iVar309 = auVar65._0_4_ >> 0x18;
  auVar280._0_8_ = CONCAT44(iVar309,iVar277);
  auVar280._8_4_ = auVar286._8_4_ >> 0x18;
  auVar289._12_4_ = auVar287._12_4_ >> 0x18;
  auVar289._0_12_ = auVar280;
  fVar435 = (float)iVar309;
  cVar218 = cVar310 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar289._0_13_;
  auVar30[0xe] = cVar218;
  auVar34[0xc] = cVar218;
  auVar34._0_12_ = auVar280;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar280._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = cVar218;
  auVar42._0_10_ = auVar280._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar280._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = cVar310;
  auVar50._0_8_ = auVar280._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar307 >> 7);
  auVar54._6_9_ = Var63;
  auVar54[5] = (char)((uint)uVar23 >> 0x10);
  auVar54[4] = (undefined1)((short)cVar307 >> 7);
  auVar54._0_4_ = iVar277;
  cVar352 = (char)((uint)uVar23 >> 8);
  auVar66._2_11_ = auVar54._4_11_;
  auVar66[1] = cVar352;
  auVar66[0] = (undefined1)((short)cVar307 >> 7);
  cVar310 = (char)uVar23;
  auVar58._2_13_ = auVar66;
  auVar58._0_2_ = CONCAT11(cVar310,cVar307);
  uVar210 = (undefined2)Var63;
  auVar292._0_12_ = auVar58._0_12_;
  auVar292._12_2_ = uVar210;
  auVar292._14_2_ = uVar210;
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._0_10_ = auVar58._0_10_;
  auVar291._10_2_ = auVar54._4_2_;
  auVar290._10_6_ = auVar291._10_6_;
  auVar290._0_8_ = auVar58._0_8_;
  auVar290._8_2_ = auVar54._4_2_;
  auVar67._4_8_ = auVar290._8_8_;
  auVar67._2_2_ = auVar66._0_2_;
  auVar67._0_2_ = auVar66._0_2_;
  iVar278 = (int)CONCAT11(cVar310,cVar307) >> 8;
  iVar309 = auVar67._0_4_ >> 0x18;
  auVar281._0_8_ = CONCAT44(iVar309,iVar278);
  auVar281._8_4_ = auVar290._8_4_ >> 0x18;
  auVar293._12_4_ = auVar291._12_4_ >> 0x18;
  auVar293._0_12_ = auVar281;
  fVar394 = (float)iVar309;
  cVar218 = cVar352 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar293._0_13_;
  auVar31[0xe] = cVar218;
  auVar35[0xc] = cVar218;
  auVar35._0_12_ = auVar281;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar281._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar218;
  auVar43._0_10_ = auVar281._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar281._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar352;
  auVar51._0_8_ = auVar281._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar310 >> 7);
  auVar55._6_9_ = Var63;
  auVar55[5] = (char)((uint)uVar24 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar310 >> 7);
  auVar55._0_4_ = iVar278;
  auVar68._2_11_ = auVar55._4_11_;
  auVar68[1] = (char)((uint)uVar24 >> 8);
  auVar68[0] = (undefined1)((short)cVar310 >> 7);
  sVar145 = CONCAT11((char)uVar24,cVar310);
  auVar59._2_13_ = auVar68;
  auVar59._0_2_ = sVar145;
  uVar210 = (undefined2)Var63;
  auVar296._0_12_ = auVar59._0_12_;
  auVar296._12_2_ = uVar210;
  auVar296._14_2_ = uVar210;
  auVar295._12_4_ = auVar296._12_4_;
  auVar295._0_10_ = auVar59._0_10_;
  auVar295._10_2_ = auVar55._4_2_;
  auVar294._10_6_ = auVar295._10_6_;
  auVar294._0_8_ = auVar59._0_8_;
  auVar294._8_2_ = auVar55._4_2_;
  auVar69._4_8_ = auVar294._8_8_;
  auVar69._2_2_ = auVar68._0_2_;
  auVar69._0_2_ = auVar68._0_2_;
  fVar326 = (float)((int)sVar145 >> 8);
  fVar338 = (float)(auVar69._0_4_ >> 0x18);
  fVar341 = (float)(auVar294._8_4_ >> 0x18);
  fVar146 = fVar421 * fVar326;
  fVar211 = fVar421 * fVar338;
  auVar149._0_8_ = CONCAT44(fVar211,fVar146);
  auVar149._8_4_ = fVar421 * fVar341;
  auVar175._12_4_ = fVar421 * (float)(auVar295._12_4_ >> 0x18);
  auVar175._0_12_ = auVar149;
  fVar424 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar131 + 0x16)) *
            *(float *)(prim + lVar131 + 0x1a);
  local_4f8 = (char)uVar135;
  cStack_4f7 = (char)((uint)uVar135 >> 8);
  uStack_4f6 = (undefined1)((uint)uVar135 >> 0x10);
  uStack_4f5 = (undefined1)((uint)uVar135 >> 0x18);
  auVar85[0xd] = 0;
  auVar85._0_13_ = auVar175._0_13_;
  auVar85[0xe] = (char)((uint)fVar211 >> 0x18);
  auVar93[0xc] = (char)((uint)fVar211 >> 0x10);
  auVar93._0_12_ = auVar149;
  auVar93._13_2_ = auVar85._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar149._0_11_;
  auVar97._12_3_ = auVar93._12_3_;
  auVar101[10] = (char)((uint)fVar211 >> 8);
  auVar101._0_10_ = auVar149._0_10_;
  auVar101._11_4_ = auVar97._11_4_;
  auVar105[9] = 0;
  auVar105._0_9_ = auVar149._0_9_;
  auVar105._10_5_ = auVar101._10_5_;
  auVar109[8] = SUB41(fVar211,0);
  auVar109._0_8_ = auVar149._0_8_;
  auVar109._9_6_ = auVar105._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar109._8_7_,uStack_4f5),(char)((uint)fVar146 >> 0x18));
  auVar113._6_9_ = Var63;
  auVar113[5] = uStack_4f6;
  auVar113[4] = (char)((uint)fVar146 >> 0x10);
  auVar113._0_4_ = fVar146;
  auVar117._2_11_ = auVar113._4_11_;
  auVar117[1] = cStack_4f7;
  auVar117[0] = (char)((uint)fVar146 >> 8);
  sVar145 = CONCAT11(local_4f8,SUB41(fVar146,0));
  auVar121._2_13_ = auVar117;
  auVar121._0_2_ = sVar145;
  uVar210 = (undefined2)Var63;
  auVar226._0_12_ = auVar121._0_12_;
  auVar226._12_2_ = uVar210;
  auVar226._14_2_ = uVar210;
  auVar156._12_4_ = auVar226._12_4_;
  auVar156._0_10_ = auVar121._0_10_;
  auVar156._10_2_ = auVar113._4_2_;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._0_8_ = auVar121._0_8_;
  auVar155._8_2_ = auVar113._4_2_;
  auVar70._4_8_ = auVar155._8_8_;
  auVar70._2_2_ = auVar117._0_2_;
  auVar70._0_2_ = auVar117._0_2_;
  iVar309 = (int)sVar145 >> 8;
  iVar212 = auVar70._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar212,iVar309);
  auVar150._8_4_ = auVar155._8_4_ >> 0x18;
  auVar157._12_4_ = auVar156._12_4_ >> 0x18;
  auVar157._0_12_ = auVar150;
  fVar369 = (float)iVar212;
  local_488._0_1_ = (char)uVar9;
  local_488._1_1_ = (char)((uint)uVar9 >> 8);
  local_488._2_1_ = (undefined1)((uint)uVar9 >> 0x10);
  local_488._3_1_ = (undefined1)((uint)uVar9 >> 0x18);
  cVar218 = cStack_4f7 >> 7;
  auVar86[0xd] = 0;
  auVar86._0_13_ = auVar157._0_13_;
  auVar86[0xe] = cVar218;
  auVar94[0xc] = cVar218;
  auVar94._0_12_ = auVar150;
  auVar94._13_2_ = auVar86._13_2_;
  auVar98[0xb] = 0;
  auVar98._0_11_ = auVar150._0_11_;
  auVar98._12_3_ = auVar94._12_3_;
  auVar102[10] = cVar218;
  auVar102._0_10_ = auVar150._0_10_;
  auVar102._11_4_ = auVar98._11_4_;
  auVar106[9] = 0;
  auVar106._0_9_ = auVar150._0_9_;
  auVar106._10_5_ = auVar102._10_5_;
  auVar110[8] = cStack_4f7;
  auVar110._0_8_ = auVar150._0_8_;
  auVar110._9_6_ = auVar106._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar110._8_7_,local_488._3_1_),(short)local_4f8 >> 7);
  auVar114._6_9_ = Var63;
  auVar114[5] = local_488._2_1_;
  auVar114[4] = (undefined1)((short)local_4f8 >> 7);
  auVar114._0_4_ = iVar309;
  auVar118._2_11_ = auVar114._4_11_;
  auVar118[1] = local_488._1_1_;
  auVar118[0] = (undefined1)((short)local_4f8 >> 7);
  auVar122._2_13_ = auVar118;
  auVar122._0_2_ = CONCAT11((char)local_488,local_4f8);
  uVar210 = (undefined2)Var63;
  auVar160._0_12_ = auVar122._0_12_;
  auVar160._12_2_ = uVar210;
  auVar160._14_2_ = uVar210;
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._0_10_ = auVar122._0_10_;
  auVar159._10_2_ = auVar114._4_2_;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._0_8_ = auVar122._0_8_;
  auVar158._8_2_ = auVar114._4_2_;
  auVar71._4_8_ = auVar158._8_8_;
  auVar71._2_2_ = auVar118._0_2_;
  auVar71._0_2_ = auVar118._0_2_;
  iVar212 = (int)CONCAT11((char)local_488,local_4f8) >> 8;
  iVar213 = auVar71._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar213,iVar212);
  auVar151._8_4_ = auVar158._8_4_ >> 0x18;
  auVar161._12_4_ = auVar159._12_4_ >> 0x18;
  auVar161._0_12_ = auVar151;
  fVar359 = (float)iVar213;
  local_4e8._0_1_ = (char)uVar10;
  local_4e8._1_1_ = (char)((uint)uVar10 >> 8);
  uStack_4e6._0_1_ = (undefined1)((uint)uVar10 >> 0x10);
  uStack_4e6._1_1_ = (undefined1)((uint)uVar10 >> 0x18);
  cVar218 = local_488._1_1_ >> 7;
  auVar87[0xd] = 0;
  auVar87._0_13_ = auVar161._0_13_;
  auVar87[0xe] = cVar218;
  auVar95[0xc] = cVar218;
  auVar95._0_12_ = auVar151;
  auVar95._13_2_ = auVar87._13_2_;
  auVar99[0xb] = 0;
  auVar99._0_11_ = auVar151._0_11_;
  auVar99._12_3_ = auVar95._12_3_;
  auVar103[10] = cVar218;
  auVar103._0_10_ = auVar151._0_10_;
  auVar103._11_4_ = auVar99._11_4_;
  auVar107[9] = 0;
  auVar107._0_9_ = auVar151._0_9_;
  auVar107._10_5_ = auVar103._10_5_;
  auVar111[8] = local_488._1_1_;
  auVar111._0_8_ = auVar151._0_8_;
  auVar111._9_6_ = auVar107._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar111._8_7_,uStack_4e6._1_1_),(short)(char)local_488 >> 7);
  auVar115._6_9_ = Var63;
  auVar115[5] = (undefined1)uStack_4e6;
  auVar115[4] = (undefined1)((short)(char)local_488 >> 7);
  auVar115._0_4_ = iVar212;
  auVar119._2_11_ = auVar115._4_11_;
  auVar119[1] = local_4e8._1_1_;
  auVar119[0] = (undefined1)((short)(char)local_488 >> 7);
  auVar123._2_13_ = auVar119;
  auVar123._0_2_ = CONCAT11((char)local_4e8,(char)local_488);
  uVar210 = (undefined2)Var63;
  auVar164._0_12_ = auVar123._0_12_;
  auVar164._12_2_ = uVar210;
  auVar164._14_2_ = uVar210;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar123._0_10_;
  auVar163._10_2_ = auVar115._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar123._0_8_;
  auVar162._8_2_ = auVar115._4_2_;
  auVar72._4_8_ = auVar162._8_8_;
  auVar72._2_2_ = auVar119._0_2_;
  auVar72._0_2_ = auVar119._0_2_;
  iVar213 = (int)CONCAT11((char)local_4e8,(char)local_488) >> 8;
  iVar214 = auVar72._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar214,iVar213);
  auVar152._8_4_ = auVar162._8_4_ >> 0x18;
  auVar165._12_4_ = auVar163._12_4_ >> 0x18;
  auVar165._0_12_ = auVar152;
  fVar339 = (float)iVar214;
  local_498 = (char)uVar11;
  cStack_497 = (char)((uint)uVar11 >> 8);
  uStack_496 = (undefined1)((uint)uVar11 >> 0x10);
  uStack_495 = (undefined1)((uint)uVar11 >> 0x18);
  cVar218 = local_4e8._1_1_ >> 7;
  auVar88[0xd] = 0;
  auVar88._0_13_ = auVar165._0_13_;
  auVar88[0xe] = cVar218;
  auVar96[0xc] = cVar218;
  auVar96._0_12_ = auVar152;
  auVar96._13_2_ = auVar88._13_2_;
  auVar100[0xb] = 0;
  auVar100._0_11_ = auVar152._0_11_;
  auVar100._12_3_ = auVar96._12_3_;
  auVar104[10] = cVar218;
  auVar104._0_10_ = auVar152._0_10_;
  auVar104._11_4_ = auVar100._11_4_;
  auVar108[9] = 0;
  auVar108._0_9_ = auVar152._0_9_;
  auVar108._10_5_ = auVar104._10_5_;
  auVar112[8] = local_4e8._1_1_;
  auVar112._0_8_ = auVar152._0_8_;
  auVar112._9_6_ = auVar108._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar112._8_7_,uStack_495),(short)(char)local_4e8 >> 7);
  auVar116._6_9_ = Var63;
  auVar116[5] = uStack_496;
  auVar116[4] = (undefined1)((short)(char)local_4e8 >> 7);
  auVar116._0_4_ = iVar213;
  auVar120._2_11_ = auVar116._4_11_;
  auVar120[1] = cStack_497;
  auVar120[0] = (undefined1)((short)(char)local_4e8 >> 7);
  auVar124._2_13_ = auVar120;
  auVar124._0_2_ = CONCAT11(local_498,(char)local_4e8);
  uVar210 = (undefined2)Var63;
  auVar168._0_12_ = auVar124._0_12_;
  auVar168._12_2_ = uVar210;
  auVar168._14_2_ = uVar210;
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar124._0_10_;
  auVar167._10_2_ = auVar116._4_2_;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar124._0_8_;
  auVar166._8_2_ = auVar116._4_2_;
  auVar73._4_8_ = auVar166._8_8_;
  auVar73._2_2_ = auVar120._0_2_;
  auVar73._0_2_ = auVar120._0_2_;
  iVar214 = (int)CONCAT11(local_498,(char)local_4e8) >> 8;
  iVar215 = auVar73._0_4_ >> 0x18;
  auVar153._0_8_ = CONCAT44(iVar215,iVar214);
  auVar153._8_4_ = auVar166._8_4_ >> 0x18;
  auVar169._12_4_ = auVar167._12_4_ >> 0x18;
  auVar169._0_12_ = auVar153;
  fVar322 = (float)iVar215;
  cVar218 = cStack_497 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar169._0_13_;
  auVar32[0xe] = cVar218;
  auVar36[0xc] = cVar218;
  auVar36._0_12_ = auVar153;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar153._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar218;
  auVar44._0_10_ = auVar153._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar153._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = cStack_497;
  auVar52._0_8_ = auVar153._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var63 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar25 >> 0x18)),(short)local_498 >> 7);
  auVar56._6_9_ = Var63;
  auVar56[5] = (char)((uint)uVar25 >> 0x10);
  auVar56[4] = (undefined1)((short)local_498 >> 7);
  auVar56._0_4_ = iVar214;
  auVar74._2_11_ = auVar56._4_11_;
  auVar74[1] = (char)((uint)uVar25 >> 8);
  auVar74[0] = (undefined1)((short)local_498 >> 7);
  sVar145 = CONCAT11((char)uVar25,local_498);
  auVar60._2_13_ = auVar74;
  auVar60._0_2_ = sVar145;
  uVar210 = (undefined2)Var63;
  auVar172._0_12_ = auVar60._0_12_;
  auVar172._12_2_ = uVar210;
  auVar172._14_2_ = uVar210;
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._0_10_ = auVar60._0_10_;
  auVar171._10_2_ = auVar56._4_2_;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._0_8_ = auVar60._0_8_;
  auVar170._8_2_ = auVar56._4_2_;
  auVar75._4_8_ = auVar170._8_8_;
  auVar75._2_2_ = auVar74._0_2_;
  auVar75._0_2_ = auVar74._0_2_;
  fVar147 = (float)((int)sVar145 >> 8);
  fVar216 = (float)(auVar75._0_4_ >> 0x18);
  fVar219 = (float)(auVar170._8_4_ >> 0x18);
  fVar413 = fVar412 * (float)iVar309 + fVar419 * (float)iVar276 + fVar421 * (float)iVar277;
  fVar420 = fVar412 * fVar369 + fVar419 * fVar401 + fVar421 * fVar435;
  fVar422 = fVar412 * (float)auVar150._8_4_ +
            fVar419 * (float)auVar279._8_4_ + fVar421 * (float)auVar280._8_4_;
  fVar423 = fVar412 * (float)auVar157._12_4_ +
            fVar419 * (float)auVar285._12_4_ + fVar421 * (float)auVar289._12_4_;
  fVar402 = fVar412 * (float)iVar212 + fVar419 * (float)iVar278 + fVar146;
  fVar409 = fVar412 * fVar359 + fVar419 * fVar394 + fVar211;
  fVar410 = fVar412 * (float)auVar151._8_4_ + fVar419 * (float)auVar281._8_4_ + auVar149._8_4_;
  fVar411 = fVar412 * (float)auVar161._12_4_ + fVar419 * (float)auVar293._12_4_ + auVar175._12_4_;
  fVar345 = fVar412 * (float)iVar213 + fVar419 * (float)iVar214 + fVar421 * fVar147;
  fVar353 = fVar412 * fVar339 + fVar419 * fVar322 + fVar421 * fVar216;
  fVar354 = fVar412 * (float)auVar152._8_4_ + fVar419 * (float)auVar153._8_4_ + fVar421 * fVar219;
  fVar412 = fVar412 * (float)auVar165._12_4_ +
            fVar419 * (float)auVar169._12_4_ + fVar421 * (float)(auVar171._12_4_ >> 0x18);
  uVar221 = *(undefined8 *)(prim + uVar126 * 7 + 6);
  uVar12 = *(undefined8 *)(prim + uVar126 * 0xb + 6);
  uVar13 = *(undefined8 *)(prim + uVar126 * 9 + 6);
  fVar366 = (float)iVar309 * fVar223 + (float)iVar276 * fVar268 + (float)iVar277 * fVar271;
  fVar435 = fVar369 * fVar223 + fVar401 * fVar268 + fVar435 * fVar271;
  fVar371 = (float)auVar150._8_4_ * fVar223 +
            (float)auVar279._8_4_ * fVar268 + (float)auVar280._8_4_ * fVar271;
  fVar373 = (float)auVar157._12_4_ * fVar223 +
            (float)auVar285._12_4_ * fVar268 + (float)auVar289._12_4_ * fVar271;
  fVar375 = (float)iVar212 * fVar223 + (float)iVar278 * fVar268 + fVar326 * fVar271;
  fVar382 = fVar359 * fVar223 + fVar394 * fVar268 + fVar338 * fVar271;
  fVar384 = (float)auVar151._8_4_ * fVar223 + (float)auVar281._8_4_ * fVar268 + fVar341 * fVar271;
  fVar386 = (float)auVar161._12_4_ * fVar223 +
            (float)auVar293._12_4_ * fVar268 + (float)(auVar295._12_4_ >> 0x18) * fVar271;
  fVar369 = fVar223 * (float)iVar213 + fVar268 * (float)iVar214 + fVar271 * fVar147;
  fVar394 = fVar223 * fVar339 + fVar268 * fVar322 + fVar271 * fVar216;
  fVar401 = fVar223 * (float)auVar152._8_4_ + fVar268 * (float)auVar153._8_4_ + fVar271 * fVar219;
  fVar419 = fVar223 * (float)auVar165._12_4_ +
            fVar268 * (float)auVar169._12_4_ + fVar271 * (float)(auVar171._12_4_ >> 0x18);
  fVar421 = (float)DAT_01f4bd50;
  fVar146 = DAT_01f4bd50._4_4_;
  fVar147 = DAT_01f4bd50._8_4_;
  fVar211 = DAT_01f4bd50._12_4_;
  uVar139 = -(uint)(fVar421 <= ABS(fVar413));
  uVar140 = -(uint)(fVar146 <= ABS(fVar420));
  uVar141 = -(uint)(fVar147 <= ABS(fVar422));
  uVar143 = -(uint)(fVar211 <= ABS(fVar423));
  auVar414._0_4_ = (uint)fVar413 & uVar139;
  auVar414._4_4_ = (uint)fVar420 & uVar140;
  auVar414._8_4_ = (uint)fVar422 & uVar141;
  auVar414._12_4_ = (uint)fVar423 & uVar143;
  auVar173._0_4_ = ~uVar139 & (uint)fVar421;
  auVar173._4_4_ = ~uVar140 & (uint)fVar146;
  auVar173._8_4_ = ~uVar141 & (uint)fVar147;
  auVar173._12_4_ = ~uVar143 & (uint)fVar211;
  auVar173 = auVar173 | auVar414;
  uVar139 = -(uint)(fVar421 <= ABS(fVar402));
  uVar140 = -(uint)(fVar146 <= ABS(fVar409));
  uVar141 = -(uint)(fVar147 <= ABS(fVar410));
  uVar143 = -(uint)(fVar211 <= ABS(fVar411));
  auVar403._0_4_ = (uint)fVar402 & uVar139;
  auVar403._4_4_ = (uint)fVar409 & uVar140;
  auVar403._8_4_ = (uint)fVar410 & uVar141;
  auVar403._12_4_ = (uint)fVar411 & uVar143;
  auVar328._0_4_ = ~uVar139 & (uint)fVar421;
  auVar328._4_4_ = ~uVar140 & (uint)fVar146;
  auVar328._8_4_ = ~uVar141 & (uint)fVar147;
  auVar328._12_4_ = ~uVar143 & (uint)fVar211;
  auVar328 = auVar328 | auVar403;
  uVar139 = -(uint)(fVar421 <= ABS(fVar345));
  uVar140 = -(uint)(fVar146 <= ABS(fVar353));
  uVar141 = -(uint)(fVar147 <= ABS(fVar354));
  uVar143 = -(uint)(fVar211 <= ABS(fVar412));
  auVar346._0_4_ = (uint)fVar345 & uVar139;
  auVar346._4_4_ = (uint)fVar353 & uVar140;
  auVar346._8_4_ = (uint)fVar354 & uVar141;
  auVar346._12_4_ = (uint)fVar412 & uVar143;
  auVar398._0_4_ = ~uVar139 & (uint)fVar421;
  auVar398._4_4_ = ~uVar140 & (uint)fVar146;
  auVar398._8_4_ = ~uVar141 & (uint)fVar147;
  auVar398._12_4_ = ~uVar143 & (uint)fVar211;
  auVar398 = auVar398 | auVar346;
  auVar226 = rcpps(_DAT_01f4bd50,auVar173);
  auVar227._0_4_ = auVar226._0_4_;
  auVar174._0_4_ = auVar173._0_4_ * auVar227._0_4_;
  fVar354 = auVar226._4_4_;
  auVar174._4_4_ = auVar173._4_4_ * fVar354;
  fVar412 = auVar226._8_4_;
  auVar174._8_4_ = auVar173._8_4_ * fVar412;
  fVar359 = auVar226._12_4_;
  auVar174._12_4_ = auVar173._12_4_ * fVar359;
  fVar402 = (1.0 - auVar174._0_4_) * auVar227._0_4_ + auVar227._0_4_;
  fVar354 = (1.0 - auVar174._4_4_) * fVar354 + fVar354;
  fVar412 = (1.0 - auVar174._8_4_) * fVar412 + fVar412;
  fVar359 = (1.0 - auVar174._12_4_) * fVar359 + fVar359;
  auVar175 = rcpps(auVar174,auVar328);
  fVar421 = auVar175._0_4_;
  fVar146 = auVar175._4_4_;
  fVar271 = auVar175._8_4_;
  fVar345 = auVar175._12_4_;
  fVar421 = (1.0 - auVar328._0_4_ * fVar421) * fVar421 + fVar421;
  fVar146 = (1.0 - auVar328._4_4_ * fVar146) * fVar146 + fVar146;
  fVar271 = (1.0 - auVar328._8_4_ * fVar271) * fVar271 + fVar271;
  fVar345 = (1.0 - auVar328._12_4_ * fVar345) * fVar345 + fVar345;
  auVar175 = rcpps(auVar175,auVar398);
  auVar176._0_4_ = auVar175._0_4_;
  fVar147 = auVar175._4_4_;
  fVar322 = auVar175._8_4_;
  fVar353 = auVar175._12_4_;
  fVar409 = (1.0 - auVar398._0_4_ * auVar176._0_4_) * auVar176._0_4_ + auVar176._0_4_;
  fVar147 = (1.0 - auVar398._4_4_ * fVar147) * fVar147 + fVar147;
  fVar322 = (1.0 - auVar398._8_4_ * fVar322) * fVar322 + fVar322;
  fVar353 = (1.0 - auVar398._12_4_ * fVar353) * fVar353 + fVar353;
  local_488._0_2_ = (short)uVar221;
  local_488._2_2_ = (undefined2)((ulong)uVar221 >> 0x10);
  uStack_484 = (undefined2)((ulong)uVar221 >> 0x20);
  uStack_482 = (undefined2)((ulong)uVar221 >> 0x30);
  auVar179._0_12_ = auVar175._0_12_;
  auVar179._12_2_ = auVar175._6_2_;
  auVar179._14_2_ = uStack_482;
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._0_10_ = auVar175._0_10_;
  auVar178._10_2_ = uStack_484;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._0_8_ = auVar175._0_8_;
  auVar177._8_2_ = auVar175._4_2_;
  auVar176._8_8_ = auVar177._8_8_;
  auVar176._6_2_ = local_488._2_2_;
  auVar176._4_2_ = auVar175._2_2_;
  auVar180._0_4_ = (float)(int)(short)local_488;
  fVar211 = (float)(auVar176._4_4_ >> 0x10);
  auVar154._0_8_ = CONCAT44(fVar211,auVar180._0_4_);
  auVar154._8_4_ = (float)(auVar177._8_4_ >> 0x10);
  local_4e8 = (short)uVar12;
  uStack_4e6 = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_4e4 = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_4e2 = (undefined2)((ulong)uVar12 >> 0x30);
  auVar230._0_12_ = auVar226._0_12_;
  auVar230._12_2_ = auVar226._6_2_;
  auVar230._14_2_ = uStack_4e2;
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._0_10_ = auVar226._0_10_;
  auVar229._10_2_ = uStack_4e4;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._0_8_ = auVar226._0_8_;
  auVar228._8_2_ = auVar226._4_2_;
  auVar227._8_8_ = auVar228._8_8_;
  auVar227._6_2_ = uStack_4e6;
  auVar227._4_2_ = auVar226._2_2_;
  auVar183._12_2_ = (short)((uint)fVar211 >> 0x10);
  auVar183._0_12_ = auVar154;
  auVar183._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._0_10_ = auVar154._0_10_;
  auVar182._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = SUB42(fVar211,0);
  auVar181._0_8_ = auVar154._0_8_;
  auVar180._8_8_ = auVar181._8_8_;
  auVar180._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar180._4_2_ = (short)((uint)auVar180._0_4_ >> 0x10);
  fVar216 = (float)(auVar180._4_4_ >> 0x10);
  fVar326 = (float)(auVar181._8_4_ >> 0x10);
  uVar136 = *(ulong *)(prim + uVar126 * 0xd + 6);
  uVar210 = (undefined2)(uVar136 >> 0x30);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar136;
  auVar233._12_2_ = uVar210;
  auVar233._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar136 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar136;
  auVar232._10_2_ = uVar210;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar210;
  auVar231._0_8_ = uVar136;
  uVar210 = (undefined2)(uVar136 >> 0x10);
  auVar76._4_8_ = auVar231._8_8_;
  auVar76._2_2_ = uVar210;
  auVar76._0_2_ = uVar210;
  uVar130 = *(ulong *)(prim + uVar126 * 0x12 + 6);
  uVar210 = (undefined2)(uVar130 >> 0x30);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar130;
  auVar186._12_2_ = uVar210;
  auVar186._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar130 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar130;
  auVar185._10_2_ = uVar210;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar210;
  auVar184._0_8_ = uVar130;
  uVar210 = (undefined2)(uVar130 >> 0x10);
  auVar77._4_8_ = auVar184._8_8_;
  auVar77._2_2_ = uVar210;
  auVar77._0_2_ = uVar210;
  fVar219 = (float)(auVar77._0_4_ >> 0x10);
  fVar338 = (float)(auVar184._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar126 * 0x16 + 6);
  uVar210 = (undefined2)(uVar14 >> 0x30);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar14;
  auVar236._12_2_ = uVar210;
  auVar236._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar14 >> 0x20);
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar14;
  auVar235._10_2_ = uVar210;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._8_2_ = uVar210;
  auVar234._0_8_ = uVar14;
  uVar210 = (undefined2)(uVar14 >> 0x10);
  auVar78._4_8_ = auVar234._8_8_;
  auVar78._2_2_ = uVar210;
  auVar78._0_2_ = uVar210;
  uVar15 = *(ulong *)(prim + uVar126 * 0x14 + 6);
  uVar210 = (undefined2)(uVar15 >> 0x30);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar15;
  auVar189._12_2_ = uVar210;
  auVar189._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar15 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar15;
  auVar188._10_2_ = uVar210;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar210;
  auVar187._0_8_ = uVar15;
  uVar210 = (undefined2)(uVar15 >> 0x10);
  auVar79._4_8_ = auVar187._8_8_;
  auVar79._2_2_ = uVar210;
  auVar79._0_2_ = uVar210;
  fVar223 = (float)(auVar79._0_4_ >> 0x10);
  fVar339 = (float)(auVar187._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar126 * 0x18 + 6);
  uVar210 = (undefined2)(uVar16 >> 0x30);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar16;
  auVar239._12_2_ = uVar210;
  auVar239._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar16 >> 0x20);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._8_2_ = 0;
  auVar238._0_8_ = uVar16;
  auVar238._10_2_ = uVar210;
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._8_2_ = uVar210;
  auVar237._0_8_ = uVar16;
  uVar210 = (undefined2)(uVar16 >> 0x10);
  auVar80._4_8_ = auVar237._8_8_;
  auVar80._2_2_ = uVar210;
  auVar80._0_2_ = uVar210;
  uVar17 = *(ulong *)(prim + uVar126 * 0x1d + 6);
  uVar210 = (undefined2)(uVar17 >> 0x30);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar17;
  auVar192._12_2_ = uVar210;
  auVar192._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar17 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar17;
  auVar191._10_2_ = uVar210;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar210;
  auVar190._0_8_ = uVar17;
  uVar210 = (undefined2)(uVar17 >> 0x10);
  auVar81._4_8_ = auVar190._8_8_;
  auVar81._2_2_ = uVar210;
  auVar81._0_2_ = uVar210;
  fVar268 = (float)(auVar81._0_4_ >> 0x10);
  fVar341 = (float)(auVar190._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar126 * 0x21 + 6);
  uVar210 = (undefined2)(uVar18 >> 0x30);
  auVar242._8_4_ = 0;
  auVar242._0_8_ = uVar18;
  auVar242._12_2_ = uVar210;
  auVar242._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar18 >> 0x20);
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._8_2_ = 0;
  auVar241._0_8_ = uVar18;
  auVar241._10_2_ = uVar210;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._8_2_ = uVar210;
  auVar240._0_8_ = uVar18;
  uVar210 = (undefined2)(uVar18 >> 0x10);
  auVar82._4_8_ = auVar240._8_8_;
  auVar82._2_2_ = uVar210;
  auVar82._0_2_ = uVar210;
  uVar19 = *(ulong *)(prim + uVar126 * 0x1f + 6);
  uVar210 = (undefined2)(uVar19 >> 0x30);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar19;
  auVar195._12_2_ = uVar210;
  auVar195._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar19 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar19;
  auVar194._10_2_ = uVar210;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar210;
  auVar193._0_8_ = uVar19;
  uVar210 = (undefined2)(uVar19 >> 0x10);
  auVar83._4_8_ = auVar193._8_8_;
  auVar83._2_2_ = uVar210;
  auVar83._0_2_ = uVar210;
  fVar410 = (float)(auVar83._0_4_ >> 0x10);
  fVar411 = (float)(auVar193._8_4_ >> 0x10);
  uVar126 = *(ulong *)(prim + uVar126 * 0x23 + 6);
  uVar210 = (undefined2)(uVar126 >> 0x30);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar126;
  auVar198._12_2_ = uVar210;
  auVar198._14_2_ = uVar210;
  uVar210 = (undefined2)(uVar126 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar126;
  auVar197._10_2_ = uVar210;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar210;
  auVar196._0_8_ = uVar126;
  uVar210 = (undefined2)(uVar126 >> 0x10);
  auVar84._4_8_ = auVar196._8_8_;
  auVar84._2_2_ = uVar210;
  auVar84._0_2_ = uVar210;
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar329._0_8_ =
       CONCAT44(((((float)(auVar227._4_4_ >> 0x10) - fVar211) * fVar424 + fVar211) - fVar435) *
                fVar354,((((float)(int)local_4e8 - auVar180._0_4_) * fVar424 + auVar180._0_4_) -
                        fVar366) * fVar402);
  auVar329._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - auVar154._8_4_) * fVar424 + auVar154._8_4_) - fVar371) *
       fVar412;
  auVar329._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar178._12_4_ >> 0x10)) * fVar424 +
        (float)(auVar178._12_4_ >> 0x10)) - fVar373) * fVar359;
  auVar377._0_4_ =
       ((((float)(int)(short)uVar136 - (float)(int)(short)uVar13) * fVar424 +
        (float)(int)(short)uVar13) - fVar366) * fVar402;
  auVar377._4_4_ =
       ((((float)(auVar76._0_4_ >> 0x10) - fVar216) * fVar424 + fVar216) - fVar435) * fVar354;
  auVar377._8_4_ =
       ((((float)(auVar231._8_4_ >> 0x10) - fVar326) * fVar424 + fVar326) - fVar371) * fVar412;
  auVar377._12_4_ =
       ((((float)(auVar232._12_4_ >> 0x10) - (float)(auVar182._12_4_ >> 0x10)) * fVar424 +
        (float)(auVar182._12_4_ >> 0x10)) - fVar373) * fVar359;
  auVar388._0_8_ =
       CONCAT44(((((float)(auVar78._0_4_ >> 0x10) - fVar219) * fVar424 + fVar219) - fVar382) *
                fVar146,((((float)(int)(short)uVar14 - (float)(int)(short)uVar130) * fVar424 +
                         (float)(int)(short)uVar130) - fVar375) * fVar421);
  auVar388._8_4_ =
       ((((float)(auVar234._8_4_ >> 0x10) - fVar338) * fVar424 + fVar338) - fVar384) * fVar271;
  auVar388._12_4_ =
       ((((float)(auVar235._12_4_ >> 0x10) - (float)(auVar185._12_4_ >> 0x10)) * fVar424 +
        (float)(auVar185._12_4_ >> 0x10)) - fVar386) * fVar345;
  aVar392._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar424 +
        (float)(int)(short)uVar15) - fVar375) * fVar421;
  aVar392._4_4_ =
       ((((float)(auVar80._0_4_ >> 0x10) - fVar223) * fVar424 + fVar223) - fVar382) * fVar146;
  aVar392._8_4_ =
       ((((float)(auVar237._8_4_ >> 0x10) - fVar339) * fVar424 + fVar339) - fVar384) * fVar271;
  aVar392._12_4_ =
       ((((float)(auVar238._12_4_ >> 0x10) - (float)(auVar188._12_4_ >> 0x10)) * fVar424 +
        (float)(auVar188._12_4_ >> 0x10)) - fVar386) * fVar345;
  auVar399._0_8_ =
       CONCAT44(((((float)(auVar82._0_4_ >> 0x10) - fVar268) * fVar424 + fVar268) - fVar394) *
                fVar147,((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar424 +
                         (float)(int)(short)uVar17) - fVar369) * fVar409);
  auVar399._8_4_ =
       ((((float)(auVar240._8_4_ >> 0x10) - fVar341) * fVar424 + fVar341) - fVar401) * fVar322;
  auVar399._12_4_ =
       ((((float)(auVar241._12_4_ >> 0x10) - (float)(auVar191._12_4_ >> 0x10)) * fVar424 +
        (float)(auVar191._12_4_ >> 0x10)) - fVar419) * fVar353;
  aVar407._0_4_ =
       ((((float)(int)(short)uVar126 - (float)(int)(short)uVar19) * fVar424 +
        (float)(int)(short)uVar19) - fVar369) * fVar409;
  aVar407._4_4_ =
       ((((float)(auVar84._0_4_ >> 0x10) - fVar410) * fVar424 + fVar410) - fVar394) * fVar147;
  aVar407._8_4_ =
       ((((float)(auVar196._8_4_ >> 0x10) - fVar411) * fVar424 + fVar411) - fVar401) * fVar322;
  aVar407._12_4_ =
       ((((float)(auVar197._12_4_ >> 0x10) - (float)(auVar194._12_4_ >> 0x10)) * fVar424 +
        (float)(auVar194._12_4_ >> 0x10)) - fVar419) * fVar353;
  auVar312._8_4_ = auVar329._8_4_;
  auVar312._0_8_ = auVar329._0_8_;
  auVar312._12_4_ = auVar329._12_4_;
  auVar226 = minps(auVar312,auVar377);
  auVar297._8_4_ = auVar388._8_4_;
  auVar297._0_8_ = auVar388._0_8_;
  auVar297._12_4_ = auVar388._12_4_;
  auVar175 = minps(auVar297,(undefined1  [16])aVar392);
  auVar226 = maxps(auVar226,auVar175);
  auVar298._8_4_ = auVar399._8_4_;
  auVar298._0_8_ = auVar399._0_8_;
  auVar298._12_4_ = auVar399._12_4_;
  auVar175 = minps(auVar298,(undefined1  [16])aVar407);
  auVar243._4_4_ = uVar135;
  auVar243._0_4_ = uVar135;
  auVar243._8_4_ = uVar135;
  auVar243._12_4_ = uVar135;
  auVar175 = maxps(auVar175,auVar243);
  auVar175 = maxps(auVar226,auVar175);
  local_48 = auVar175._0_4_ * 0.99999964;
  fStack_44 = auVar175._4_4_ * 0.99999964;
  fStack_40 = auVar175._8_4_ * 0.99999964;
  fStack_3c = auVar175._12_4_ * 0.99999964;
  auVar175 = maxps(auVar329,auVar377);
  auVar226 = maxps(auVar388,(undefined1  [16])aVar392);
  auVar175 = minps(auVar175,auVar226);
  auVar226 = maxps(auVar399,(undefined1  [16])aVar407);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar244._4_4_ = uVar135;
  auVar244._0_4_ = uVar135;
  auVar244._8_4_ = uVar135;
  auVar244._12_4_ = uVar135;
  auVar226 = minps(auVar226,auVar244);
  auVar175 = minps(auVar175,auVar226);
  auVar245._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && local_48 <= auVar175._0_4_ * 1.0000004);
  auVar245._4_4_ = -(uint)(1 < (byte)PVar20 && fStack_44 <= auVar175._4_4_ * 1.0000004);
  auVar245._8_4_ = -(uint)(2 < (byte)PVar20 && fStack_40 <= auVar175._8_4_ * 1.0000004);
  auVar245._12_4_ = -(uint)(3 < (byte)PVar20 && fStack_3c <= auVar175._12_4_ * 1.0000004);
  uVar135 = movmskps((int)ray,auVar245);
  uVar136 = CONCAT44((int)((ulong)ray >> 0x20),uVar135);
  local_3d8 = mm_lookupmask_ps._0_8_;
  uStack_3d0 = mm_lookupmask_ps._8_8_;
  lVar131 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  do {
    if (uVar136 == 0) {
      return;
    }
    lVar134 = 0;
    if (uVar136 != 0) {
      for (; (uVar136 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
      }
    }
    uVar139 = *(uint *)(prim + 2);
    pRVar129 = (RTCIntersectArguments *)(ulong)uVar139;
    uVar140 = *(uint *)(prim + lVar134 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[(long)pRVar129].ptr;
    uVar130 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (ulong)uVar140 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar421 = pGVar26->fnumTimeSegments;
    fVar146 = (pGVar26->time_range).lower;
    fVar147 = ((*(float *)(ray + k * 4 + 0x70) - fVar146) / ((pGVar26->time_range).upper - fVar146))
              * fVar421;
    fVar146 = floorf(fVar147);
    fVar421 = fVar421 + -1.0;
    if (fVar421 <= fVar146) {
      fVar146 = fVar421;
    }
    fVar421 = 0.0;
    if (0.0 <= fVar146) {
      fVar421 = fVar146;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar137 = (long)(int)fVar421 * 0x38;
    lVar134 = *(long *)(_Var27 + lVar137);
    lVar138 = *(long *)(_Var27 + 0x10 + lVar137);
    pGVar133 = *(Geometry **)(_Var27 + 0x38 + lVar137);
    lVar137 = *(long *)(_Var27 + 0x48 + lVar137);
    pRVar132 = (RTCIntersectArguments *)(lVar138 * (uVar130 + 3));
    ppp_Var1 = (_func_int ***)((long)&(pGVar133->super_RefCount)._vptr_RefCount + uVar130 * lVar137)
    ;
    pfVar2 = (float *)(lVar134 + lVar138 * uVar130);
    ppp_Var3 = (_func_int ***)
               ((long)&(pGVar133->super_RefCount)._vptr_RefCount + (uVar130 + 1) * lVar137);
    pfVar4 = (float *)(lVar134 + lVar138 * (uVar130 + 1));
    ppp_Var5 = (_func_int ***)
               ((long)&(pGVar133->super_RefCount)._vptr_RefCount + (uVar130 + 2) * lVar137);
    pfVar6 = (float *)(lVar134 + lVar138 * (uVar130 + 2));
    fVar147 = fVar147 - fVar421;
    fVar421 = 1.0 - fVar147;
    fVar339 = *pfVar2 * fVar421 + *(float *)ppp_Var1 * fVar147;
    fVar345 = pfVar2[1] * fVar421 + *(float *)((long)ppp_Var1 + 4) * fVar147;
    fVar354 = pfVar2[2] * fVar421 +
              *(float *)&(((atomic<unsigned_long> *)(ppp_Var1 + 1))->
                         super___atomic_base<unsigned_long>)._M_i * fVar147;
    fVar359 = pfVar2[3] * fVar421 + *(float *)((long)ppp_Var1 + 0xc) * fVar147;
    local_3a8 = *pfVar4 * fVar421 + *(float *)ppp_Var3 * fVar147;
    fStack_3a4 = pfVar4[1] * fVar421 + *(float *)((long)ppp_Var3 + 4) * fVar147;
    fStack_3a0 = pfVar4[2] * fVar421 +
                 *(float *)&(((atomic<unsigned_long> *)(ppp_Var3 + 1))->
                            super___atomic_base<unsigned_long>)._M_i * fVar147;
    fVar375 = pfVar4[3] * fVar421 + *(float *)((long)ppp_Var3 + 0xc) * fVar147;
    local_3b8 = *pfVar6 * fVar421 + *(float *)ppp_Var5 * fVar147;
    fStack_3b4 = pfVar6[1] * fVar421 + *(float *)((long)ppp_Var5 + 4) * fVar147;
    fStack_3b0 = pfVar6[2] * fVar421 +
                 *(float *)&(((atomic<unsigned_long> *)(ppp_Var5 + 1))->
                            super___atomic_base<unsigned_long>)._M_i * fVar147;
    fVar366 = pfVar6[3] * fVar421 + *(float *)((long)ppp_Var5 + 0xc) * fVar147;
    ppp_Var1 = (_func_int ***)
               ((long)&(pGVar133->super_RefCount)._vptr_RefCount + lVar137 * (uVar130 + 3));
    pfVar2 = (float *)((long)&pRVar132->flags + lVar134);
    local_3c8 = fVar421 * *pfVar2 + fVar147 * *(float *)ppp_Var1;
    fStack_3c4 = fVar421 * pfVar2[1] + fVar147 * *(float *)((long)ppp_Var1 + 4);
    fStack_3c0 = fVar421 * pfVar2[2] +
                 fVar147 * *(float *)&(((atomic<unsigned_long> *)(ppp_Var1 + 1))->
                                      super___atomic_base<unsigned_long>)._M_i;
    fVar409 = fVar421 * pfVar2[3] + fVar147 * *(float *)((long)ppp_Var1 + 0xc);
    iVar309 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar421 = *(float *)(ray + k * 4);
    fVar146 = *(float *)(ray + k * 4 + 0x10);
    fVar147 = *(float *)(ray + k * 4 + 0x20);
    fVar341 = fVar339 - fVar421;
    fVar353 = fVar345 - fVar146;
    fVar412 = fVar354 - fVar147;
    fVar211 = pre->ray_space[k].vx.field_0.m128[0];
    fVar216 = pre->ray_space[k].vx.field_0.m128[1];
    fVar219 = pre->ray_space[k].vx.field_0.m128[2];
    fVar223 = pre->ray_space[k].vy.field_0.m128[0];
    fVar268 = pre->ray_space[k].vy.field_0.m128[1];
    fVar271 = pre->ray_space[k].vy.field_0.m128[2];
    fVar322 = pre->ray_space[k].vz.field_0.m128[0];
    fVar326 = pre->ray_space[k].vz.field_0.m128[1];
    fVar338 = pre->ray_space[k].vz.field_0.m128[2];
    fVar369 = fVar341 * fVar211 + fVar353 * fVar223 + fVar412 * fVar322;
    fVar394 = fVar341 * fVar216 + fVar353 * fVar268 + fVar412 * fVar326;
    fVar401 = fVar341 * fVar219 + fVar353 * fVar271 + fVar412 * fVar338;
    fVar341 = local_3a8 - fVar421;
    fVar353 = fStack_3a4 - fVar146;
    fVar412 = fStack_3a0 - fVar147;
    fVar435 = fVar341 * fVar211 + fVar353 * fVar223 + fVar412 * fVar322;
    fVar371 = fVar341 * fVar216 + fVar353 * fVar268 + fVar412 * fVar326;
    fVar373 = fVar341 * fVar219 + fVar353 * fVar271 + fVar412 * fVar338;
    fVar341 = local_3b8 - fVar421;
    fVar353 = fStack_3b4 - fVar146;
    fVar412 = fStack_3b0 - fVar147;
    fVar419 = fVar341 * fVar211 + fVar353 * fVar223 + fVar412 * fVar322;
    fVar402 = fVar341 * fVar216 + fVar353 * fVar268 + fVar412 * fVar326;
    fVar341 = fVar341 * fVar219 + fVar353 * fVar271 + fVar412 * fVar338;
    fVar421 = local_3c8 - fVar421;
    fVar146 = fStack_3c4 - fVar146;
    fVar147 = fStack_3c0 - fVar147;
    fVar211 = fVar421 * fVar211 + fVar146 * fVar223 + fVar147 * fVar322;
    fVar216 = fVar421 * fVar216 + fVar146 * fVar268 + fVar147 * fVar326;
    fVar146 = fVar421 * fVar219 + fVar146 * fVar271 + fVar147 * fVar338;
    auVar378._0_8_ = CONCAT44(fVar394,fVar369) & 0x7fffffff7fffffff;
    auVar378._8_4_ = ABS(fVar401);
    auVar378._12_4_ = ABS(fVar359);
    auVar330._0_8_ = CONCAT44(fVar371,fVar435) & 0x7fffffff7fffffff;
    auVar330._8_4_ = ABS(fVar373);
    auVar330._12_4_ = ABS(fVar375);
    auVar226 = maxps(auVar378,auVar330);
    auVar347._0_8_ = CONCAT44(fVar402,fVar419) & 0x7fffffff7fffffff;
    auVar347._8_4_ = ABS(fVar341);
    auVar347._12_4_ = ABS(fVar366);
    auVar246._0_8_ = CONCAT44(fVar216,fVar211) & 0x7fffffff7fffffff;
    auVar246._8_4_ = ABS(fVar146);
    auVar246._12_4_ = ABS(fVar409);
    auVar175 = maxps(auVar347,auVar246);
    auVar175 = maxps(auVar226,auVar175);
    uVar221 = auVar175._8_8_;
    fVar421 = auVar175._4_4_;
    if (auVar175._4_4_ <= auVar175._0_4_) {
      fVar421 = auVar175._0_4_;
    }
    auVar379._8_8_ = uVar221;
    auVar379._0_8_ = uVar221;
    fVar147 = (float)iVar309;
    if (auVar175._8_4_ <= fVar421) {
      auVar380._4_12_ = auVar379._4_12_;
      auVar380._0_4_ = fVar421;
      uVar221 = auVar380._0_8_;
    }
    lVar134 = (long)iVar309 * 0x44;
    fVar219 = *(float *)(bezier_basis0 + lVar134 + 0x908);
    fVar223 = *(float *)(bezier_basis0 + lVar134 + 0x90c);
    fVar268 = *(float *)(bezier_basis0 + lVar134 + 0x910);
    fVar271 = *(float *)(bezier_basis0 + lVar134 + 0x914);
    fVar421 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar134 + 0xd8c);
    fVar322 = *(float *)(bezier_basis0 + lVar134 + 0xd90);
    fVar326 = *(float *)(bezier_basis0 + lVar134 + 0xd94);
    auVar62 = *(undefined1 (*) [12])(bezier_basis0 + lVar134 + 0xd8c);
    fVar338 = *(float *)(bezier_basis0 + lVar134 + 0xd98);
    fVar353 = *(float *)(bezier_basis0 + lVar134 + 0x484);
    fVar412 = *(float *)(bezier_basis0 + lVar134 + 0x488);
    fVar382 = *(float *)(bezier_basis0 + lVar134 + 0x48c);
    fVar384 = *(float *)(bezier_basis0 + lVar134 + 0x490);
    fVar386 = *(float *)(bezier_basis0 + lVar134);
    fVar410 = *(float *)(bezier_basis0 + lVar134 + 4);
    fVar411 = *(float *)(bezier_basis0 + lVar134 + 8);
    fVar413 = *(float *)(bezier_basis0 + lVar134 + 0xc);
    fVar311 = fVar369 * fVar386 + fVar435 * fVar353 + fVar419 * fVar219 + fVar211 * fVar421;
    fVar323 = fVar369 * fVar410 + fVar435 * fVar412 + fVar419 * fVar223 + fVar211 * fVar322;
    fVar324 = fVar369 * fVar411 + fVar435 * fVar382 + fVar419 * fVar268 + fVar211 * fVar326;
    fVar325 = fVar369 * fVar413 + fVar435 * fVar384 + fVar419 * fVar271 + fVar211 * fVar338;
    fVar432 = fVar394 * fVar386 + fVar371 * fVar353 + fVar402 * fVar219 + fVar216 * fVar421;
    fVar436 = fVar394 * fVar410 + fVar371 * fVar412 + fVar402 * fVar223 + fVar216 * fVar322;
    fVar440 = fVar394 * fVar411 + fVar371 * fVar382 + fVar402 * fVar268 + fVar216 * fVar326;
    fVar444 = fVar394 * fVar413 + fVar371 * fVar384 + fVar402 * fVar271 + fVar216 * fVar338;
    auVar404._0_4_ = fVar359 * fVar386 + fVar375 * fVar353 + fVar366 * fVar219 + fVar409 * fVar421;
    auVar404._4_4_ = fVar359 * fVar410 + fVar375 * fVar412 + fVar366 * fVar223 + fVar409 * fVar322;
    auVar404._8_4_ = fVar359 * fVar411 + fVar375 * fVar382 + fVar366 * fVar268 + fVar409 * fVar326;
    auVar404._12_4_ = fVar359 * fVar413 + fVar375 * fVar384 + fVar366 * fVar271 + fVar409 * fVar338;
    fVar322 = *(float *)(bezier_basis1 + lVar134 + 0xd8c);
    fVar326 = *(float *)(bezier_basis1 + lVar134 + 0xd90);
    fVar420 = *(float *)(bezier_basis1 + lVar134 + 0xd94);
    fVar422 = *(float *)(bezier_basis1 + lVar134 + 0xd98);
    fVar423 = *(float *)(bezier_basis1 + lVar134 + 0x908);
    fVar424 = *(float *)(bezier_basis1 + lVar134 + 0x90c);
    fVar344 = *(float *)(bezier_basis1 + lVar134 + 0x910);
    fVar434 = *(float *)(bezier_basis1 + lVar134 + 0x914);
    fVar439 = *(float *)(bezier_basis1 + lVar134 + 0x484);
    fVar443 = *(float *)(bezier_basis1 + lVar134 + 0x488);
    fVar447 = *(float *)(bezier_basis1 + lVar134 + 0x48c);
    fVar376 = *(float *)(bezier_basis1 + lVar134 + 0x490);
    fVar383 = *(float *)(bezier_basis1 + lVar134);
    fVar385 = *(float *)(bezier_basis1 + lVar134 + 4);
    fVar387 = *(float *)(bezier_basis1 + lVar134 + 8);
    fVar391 = *(float *)(bezier_basis1 + lVar134 + 0xc);
    fVar367 = fVar369 * fVar383 + fVar435 * fVar439 + fVar419 * fVar423 + fVar211 * fVar322;
    fVar370 = fVar369 * fVar385 + fVar435 * fVar443 + fVar419 * fVar424 + fVar211 * fVar326;
    fVar372 = fVar369 * fVar387 + fVar435 * fVar447 + fVar419 * fVar344 + fVar211 * fVar420;
    fVar374 = fVar369 * fVar391 + fVar435 * fVar376 + fVar419 * fVar434 + fVar211 * fVar422;
    fVar355 = fVar394 * fVar383 + fVar371 * fVar439 + fVar402 * fVar423 + fVar216 * fVar322;
    fVar360 = fVar394 * fVar385 + fVar371 * fVar443 + fVar402 * fVar424 + fVar216 * fVar326;
    fVar362 = fVar394 * fVar387 + fVar371 * fVar447 + fVar402 * fVar344 + fVar216 * fVar420;
    fVar364 = fVar394 * fVar391 + fVar371 * fVar376 + fVar402 * fVar434 + fVar216 * fVar422;
    auVar299._0_4_ = fVar359 * fVar383 + fVar375 * fVar439 + fVar366 * fVar423 + fVar409 * fVar322;
    auVar299._4_4_ = fVar359 * fVar385 + fVar375 * fVar443 + fVar366 * fVar424 + fVar409 * fVar326;
    auVar299._8_4_ = fVar359 * fVar387 + fVar375 * fVar447 + fVar366 * fVar344 + fVar409 * fVar420;
    auVar299._12_4_ = fVar359 * fVar391 + fVar375 * fVar376 + fVar366 * fVar434 + fVar409 * fVar422;
    fVar327 = fVar367 - fVar311;
    fVar340 = fVar370 - fVar323;
    fVar342 = fVar372 - fVar324;
    fVar343 = fVar374 - fVar325;
    fVar356 = fVar355 - fVar432;
    fVar361 = fVar360 - fVar436;
    fVar363 = fVar362 - fVar440;
    fVar365 = fVar364 - fVar444;
    fVar421 = fVar432 * fVar327 - fVar311 * fVar356;
    fVar437 = fVar436 * fVar340 - fVar323 * fVar361;
    fVar441 = fVar440 * fVar342 - fVar324 * fVar363;
    fVar445 = fVar444 * fVar343 - fVar325 * fVar365;
    auVar175 = maxps(auVar404,auVar299);
    bVar91 = fVar421 * fVar421 <=
             auVar175._0_4_ * auVar175._0_4_ * (fVar327 * fVar327 + fVar356 * fVar356) &&
             0.0 < fVar147;
    bVar92 = fVar437 * fVar437 <=
             auVar175._4_4_ * auVar175._4_4_ * (fVar340 * fVar340 + fVar361 * fVar361) &&
             1.0 < fVar147;
    bVar90 = fVar441 * fVar441 <=
             auVar175._8_4_ * auVar175._8_4_ * (fVar342 * fVar342 + fVar363 * fVar363) &&
             2.0 < fVar147;
    bVar89 = 3.0 < fVar147 &&
             fVar445 * fVar445 <=
             auVar175._12_4_ * auVar175._12_4_ * (fVar343 * fVar343 + fVar365 * fVar365);
    local_488 = (float)uVar221;
    local_488 = local_488 * 4.7683716e-07;
    auVar28._4_4_ = -(uint)bVar92;
    auVar28._0_4_ = -(uint)bVar91;
    auVar28._8_4_ = -(uint)bVar90;
    auVar28._12_4_ = -(uint)bVar89;
    iVar212 = movmskps((int)(pre->ray_space + k),auVar28);
    fVar421 = *(float *)(ray + k * 4 + 0x30);
    _local_398 = ZEXT416((uint)fVar421);
    local_3e0 = pRVar129;
    fStack_3bc = fVar409;
    fStack_3ac = fVar366;
    fStack_39c = fVar375;
    if (iVar212 != 0) {
      fVar148 = fVar322 * fVar146 + fVar423 * fVar341 + fVar439 * fVar373 + fVar383 * fVar401;
      fVar217 = fVar326 * fVar146 + fVar424 * fVar341 + fVar443 * fVar373 + fVar385 * fVar401;
      fVar220 = fVar420 * fVar146 + fVar344 * fVar341 + fVar447 * fVar373 + fVar387 * fVar401;
      fVar222 = fVar422 * fVar146 + fVar434 * fVar341 + fVar376 * fVar373 + fVar391 * fVar401;
      local_518._0_4_ = auVar62._0_4_;
      local_518._4_4_ = auVar62._4_4_;
      fStack_510 = auVar62._8_4_;
      fVar224 = (float)local_518._0_4_ * fVar146 + fVar219 * fVar341 + fVar353 * fVar373 +
                fVar386 * fVar401;
      fVar269 = (float)local_518._4_4_ * fVar146 + fVar223 * fVar341 + fVar412 * fVar373 +
                fVar410 * fVar401;
      fVar272 = fStack_510 * fVar146 + fVar268 * fVar341 + fVar382 * fVar373 + fVar411 * fVar401;
      fVar274 = fVar338 * fVar146 + fVar271 * fVar341 + fVar384 * fVar373 + fVar413 * fVar401;
      fVar219 = *(float *)(bezier_basis0 + lVar134 + 0x1210);
      fVar223 = *(float *)(bezier_basis0 + lVar134 + 0x1214);
      fVar268 = *(float *)(bezier_basis0 + lVar134 + 0x1218);
      fVar271 = *(float *)(bezier_basis0 + lVar134 + 0x121c);
      fVar322 = *(float *)(bezier_basis0 + lVar134 + 0x1694);
      fVar326 = *(float *)(bezier_basis0 + lVar134 + 0x1698);
      fVar338 = *(float *)(bezier_basis0 + lVar134 + 0x169c);
      fVar353 = *(float *)(bezier_basis0 + lVar134 + 0x16a0);
      fVar412 = *(float *)(bezier_basis0 + lVar134 + 0x1b18);
      fVar382 = *(float *)(bezier_basis0 + lVar134 + 0x1b1c);
      fVar384 = *(float *)(bezier_basis0 + lVar134 + 0x1b20);
      fVar386 = *(float *)(bezier_basis0 + lVar134 + 0x1b24);
      fVar410 = *(float *)(bezier_basis0 + lVar134 + 0x1f9c);
      fVar411 = *(float *)(bezier_basis0 + lVar134 + 0x1fa0);
      fVar413 = *(float *)(bezier_basis0 + lVar134 + 0x1fa4);
      fVar420 = *(float *)(bezier_basis0 + lVar134 + 0x1fa8);
      fVar390 = fVar369 * fVar219 + fVar435 * fVar322 + fVar419 * fVar412 + fVar211 * fVar410;
      fVar395 = fVar369 * fVar223 + fVar435 * fVar326 + fVar419 * fVar382 + fVar211 * fVar411;
      fVar396 = fVar369 * fVar268 + fVar435 * fVar338 + fVar419 * fVar384 + fVar211 * fVar413;
      fVar397 = fVar369 * fVar271 + fVar435 * fVar353 + fVar419 * fVar386 + fVar211 * fVar420;
      fVar433 = fVar394 * fVar219 + fVar371 * fVar322 + fVar402 * fVar412 + fVar216 * fVar410;
      fVar438 = fVar394 * fVar223 + fVar371 * fVar326 + fVar402 * fVar382 + fVar216 * fVar411;
      fVar442 = fVar394 * fVar268 + fVar371 * fVar338 + fVar402 * fVar384 + fVar216 * fVar413;
      fVar446 = fVar394 * fVar271 + fVar371 * fVar353 + fVar402 * fVar386 + fVar216 * fVar420;
      fVar422 = *(float *)(bezier_basis1 + lVar134 + 0x1210);
      fVar423 = *(float *)(bezier_basis1 + lVar134 + 0x1214);
      fVar424 = *(float *)(bezier_basis1 + lVar134 + 0x1218);
      fVar344 = *(float *)(bezier_basis1 + lVar134 + 0x121c);
      fVar434 = *(float *)(bezier_basis1 + lVar134 + 0x1b18);
      fVar439 = *(float *)(bezier_basis1 + lVar134 + 0x1b1c);
      fVar443 = *(float *)(bezier_basis1 + lVar134 + 0x1b20);
      fVar447 = *(float *)(bezier_basis1 + lVar134 + 0x1b24);
      fVar376 = *(float *)(bezier_basis1 + lVar134 + 0x1f9c);
      fVar383 = *(float *)(bezier_basis1 + lVar134 + 0x1fa0);
      fVar385 = *(float *)(bezier_basis1 + lVar134 + 0x1fa4);
      fVar387 = *(float *)(bezier_basis1 + lVar134 + 0x1fa8);
      auVar331._0_4_ = fVar402 * fVar434 + fVar216 * fVar376;
      auVar331._4_4_ = fVar402 * fVar439 + fVar216 * fVar383;
      auVar331._8_4_ = fVar402 * fVar443 + fVar216 * fVar385;
      auVar331._12_4_ = fVar402 * fVar447 + fVar216 * fVar387;
      fVar391 = *(float *)(bezier_basis1 + lVar134 + 0x1694);
      fVar437 = *(float *)(bezier_basis1 + lVar134 + 0x1698);
      fVar441 = *(float *)(bezier_basis1 + lVar134 + 0x169c);
      fVar445 = *(float *)(bezier_basis1 + lVar134 + 0x16a0);
      fVar425 = fVar369 * fVar422 + fVar435 * fVar391 + fVar419 * fVar434 + fVar211 * fVar376;
      fVar429 = fVar369 * fVar423 + fVar435 * fVar437 + fVar419 * fVar439 + fVar211 * fVar383;
      fVar430 = fVar369 * fVar424 + fVar435 * fVar441 + fVar419 * fVar443 + fVar211 * fVar385;
      fVar431 = fVar369 * fVar344 + fVar435 * fVar445 + fVar419 * fVar447 + fVar211 * fVar387;
      fVar225 = fVar394 * fVar422 + fVar371 * fVar391 + auVar331._0_4_;
      fVar270 = fVar394 * fVar423 + fVar371 * fVar437 + auVar331._4_4_;
      fVar273 = fVar394 * fVar424 + fVar371 * fVar441 + auVar331._8_4_;
      fVar275 = fVar394 * fVar344 + fVar371 * fVar445 + auVar331._12_4_;
      auVar405._0_8_ = CONCAT44(fVar395,fVar390) & 0x7fffffff7fffffff;
      auVar405._8_4_ = ABS(fVar396);
      auVar405._12_4_ = ABS(fVar397);
      auVar381._0_8_ = CONCAT44(fVar438,fVar433) & 0x7fffffff7fffffff;
      auVar381._8_4_ = ABS(fVar442);
      auVar381._12_4_ = ABS(fVar446);
      auVar175 = maxps(auVar405,auVar381);
      auVar415._0_8_ =
           CONCAT44(fVar223 * fVar401 + fVar326 * fVar373 + fVar382 * fVar341 + fVar411 * fVar146,
                    fVar219 * fVar401 + fVar322 * fVar373 + fVar412 * fVar341 + fVar410 * fVar146) &
           0x7fffffff7fffffff;
      auVar415._8_4_ =
           ABS(fVar268 * fVar401 + fVar338 * fVar373 + fVar384 * fVar341 + fVar413 * fVar146);
      auVar415._12_4_ =
           ABS(fVar271 * fVar401 + fVar353 * fVar373 + fVar386 * fVar341 + fVar420 * fVar146);
      auVar175 = maxps(auVar175,auVar415);
      uVar141 = -(uint)(local_488 <= auVar175._0_4_);
      uVar143 = -(uint)(local_488 <= auVar175._4_4_);
      uVar142 = -(uint)(local_488 <= auVar175._8_4_);
      uVar144 = -(uint)(local_488 <= auVar175._12_4_);
      fVar326 = (float)((uint)fVar390 & uVar141 | ~uVar141 & (uint)fVar327);
      fVar353 = (float)((uint)fVar395 & uVar143 | ~uVar143 & (uint)fVar340);
      fVar412 = (float)((uint)fVar396 & uVar142 | ~uVar142 & (uint)fVar342);
      fVar382 = (float)((uint)fVar397 & uVar144 | ~uVar144 & (uint)fVar343);
      fVar384 = (float)(~uVar141 & (uint)fVar356 | (uint)fVar433 & uVar141);
      fVar386 = (float)(~uVar143 & (uint)fVar361 | (uint)fVar438 & uVar143);
      fVar410 = (float)(~uVar142 & (uint)fVar363 | (uint)fVar442 & uVar142);
      fVar411 = (float)(~uVar144 & (uint)fVar365 | (uint)fVar446 & uVar144);
      auVar416._0_8_ = CONCAT44(fVar429,fVar425) & 0x7fffffff7fffffff;
      auVar416._8_4_ = ABS(fVar430);
      auVar416._12_4_ = ABS(fVar431);
      auVar389._0_8_ = CONCAT44(fVar270,fVar225) & 0x7fffffff7fffffff;
      auVar389._8_4_ = ABS(fVar273);
      auVar389._12_4_ = ABS(fVar275);
      auVar175 = maxps(auVar416,auVar389);
      auVar357._0_8_ =
           CONCAT44(fVar423 * fVar401 + fVar437 * fVar373 + fVar439 * fVar341 + fVar383 * fVar146,
                    fVar422 * fVar401 + fVar391 * fVar373 + fVar434 * fVar341 + fVar376 * fVar146) &
           0x7fffffff7fffffff;
      auVar357._8_4_ =
           ABS(fVar424 * fVar401 + fVar441 * fVar373 + fVar443 * fVar341 + fVar385 * fVar146);
      auVar357._12_4_ =
           ABS(fVar344 * fVar401 + fVar445 * fVar373 + fVar447 * fVar341 + fVar387 * fVar146);
      auVar175 = maxps(auVar175,auVar357);
      uVar141 = -(uint)(local_488 <= auVar175._0_4_);
      uVar143 = -(uint)(local_488 <= auVar175._4_4_);
      uVar142 = -(uint)(local_488 <= auVar175._8_4_);
      uVar144 = -(uint)(local_488 <= auVar175._12_4_);
      fVar424 = (float)((uint)fVar425 & uVar141 | ~uVar141 & (uint)fVar327);
      fVar344 = (float)((uint)fVar429 & uVar143 | ~uVar143 & (uint)fVar340);
      fVar376 = (float)((uint)fVar430 & uVar142 | ~uVar142 & (uint)fVar342);
      fVar383 = (float)((uint)fVar431 & uVar144 | ~uVar144 & (uint)fVar343);
      fVar413 = (float)(~uVar141 & (uint)fVar356 | (uint)fVar225 & uVar141);
      fVar420 = (float)(~uVar143 & (uint)fVar361 | (uint)fVar270 & uVar143);
      fVar422 = (float)(~uVar142 & (uint)fVar363 | (uint)fVar273 & uVar142);
      fVar423 = (float)(~uVar144 & (uint)fVar365 | (uint)fVar275 & uVar144);
      auVar247._0_4_ = fVar384 * fVar384 + fVar326 * fVar326;
      auVar247._4_4_ = fVar386 * fVar386 + fVar353 * fVar353;
      auVar247._8_4_ = fVar410 * fVar410 + fVar412 * fVar412;
      auVar247._12_4_ = fVar411 * fVar411 + fVar382 * fVar382;
      auVar175 = rsqrtps(auVar331,auVar247);
      fVar219 = auVar175._0_4_;
      fVar223 = auVar175._4_4_;
      fVar268 = auVar175._8_4_;
      fVar271 = auVar175._12_4_;
      auVar332._0_4_ = fVar219 * fVar219 * auVar247._0_4_ * 0.5 * fVar219;
      auVar332._4_4_ = fVar223 * fVar223 * auVar247._4_4_ * 0.5 * fVar223;
      auVar332._8_4_ = fVar268 * fVar268 * auVar247._8_4_ * 0.5 * fVar268;
      auVar332._12_4_ = fVar271 * fVar271 * auVar247._12_4_ * 0.5 * fVar271;
      fVar434 = fVar219 * 1.5 - auVar332._0_4_;
      fVar439 = fVar223 * 1.5 - auVar332._4_4_;
      fVar443 = fVar268 * 1.5 - auVar332._8_4_;
      fVar447 = fVar271 * 1.5 - auVar332._12_4_;
      auVar248._0_4_ = fVar413 * fVar413 + fVar424 * fVar424;
      auVar248._4_4_ = fVar420 * fVar420 + fVar344 * fVar344;
      auVar248._8_4_ = fVar422 * fVar422 + fVar376 * fVar376;
      auVar248._12_4_ = fVar423 * fVar423 + fVar383 * fVar383;
      auVar175 = rsqrtps(auVar332,auVar248);
      fVar219 = auVar175._0_4_;
      fVar223 = auVar175._4_4_;
      fVar268 = auVar175._8_4_;
      fVar271 = auVar175._12_4_;
      fVar219 = fVar219 * 1.5 - fVar219 * fVar219 * auVar248._0_4_ * 0.5 * fVar219;
      fVar322 = fVar223 * 1.5 - fVar223 * fVar223 * auVar248._4_4_ * 0.5 * fVar223;
      fVar268 = fVar268 * 1.5 - fVar268 * fVar268 * auVar248._8_4_ * 0.5 * fVar268;
      fVar338 = fVar271 * 1.5 - fVar271 * fVar271 * auVar248._12_4_ * 0.5 * fVar271;
      fVar365 = fVar384 * fVar434 * auVar404._0_4_;
      fVar437 = fVar386 * fVar439 * auVar404._4_4_;
      fVar441 = fVar410 * fVar443 * auVar404._8_4_;
      fVar445 = fVar411 * fVar447 * auVar404._12_4_;
      fVar223 = -fVar326 * fVar434 * auVar404._0_4_;
      fVar271 = -fVar353 * fVar439 * auVar404._4_4_;
      fVar326 = -fVar412 * fVar443 * auVar404._8_4_;
      fVar353 = -fVar382 * fVar447 * auVar404._12_4_;
      fVar390 = fVar434 * 0.0 * auVar404._0_4_;
      fVar395 = fVar439 * 0.0 * auVar404._4_4_;
      fVar396 = fVar443 * 0.0 * auVar404._8_4_;
      fVar397 = fVar447 * 0.0 * auVar404._12_4_;
      fVar225 = fVar413 * fVar219 * auVar299._0_4_;
      fVar270 = fVar420 * fVar322 * auVar299._4_4_;
      fVar273 = fVar422 * fVar268 * auVar299._8_4_;
      fVar275 = fVar423 * fVar338 * auVar299._12_4_;
      fVar434 = fVar367 + fVar225;
      fVar439 = fVar370 + fVar270;
      fVar443 = fVar372 + fVar273;
      fVar447 = fVar374 + fVar275;
      fVar410 = -fVar424 * fVar219 * auVar299._0_4_;
      fVar411 = -fVar344 * fVar322 * auVar299._4_4_;
      fVar413 = -fVar376 * fVar268 * auVar299._8_4_;
      fVar420 = -fVar383 * fVar338 * auVar299._12_4_;
      fVar343 = fVar355 + fVar410;
      fVar356 = fVar360 + fVar411;
      fVar361 = fVar362 + fVar413;
      fVar363 = fVar364 + fVar420;
      fVar376 = fVar219 * 0.0 * auVar299._0_4_;
      fVar383 = fVar322 * 0.0 * auVar299._4_4_;
      fVar385 = fVar268 * 0.0 * auVar299._8_4_;
      fVar387 = fVar338 * 0.0 * auVar299._12_4_;
      fVar219 = fVar311 - fVar365;
      fVar268 = fVar323 - fVar437;
      fVar322 = fVar324 - fVar441;
      fVar338 = fVar325 - fVar445;
      fVar412 = fVar148 + fVar376;
      fVar382 = fVar217 + fVar383;
      fVar384 = fVar220 + fVar385;
      fVar386 = fVar222 + fVar387;
      fVar391 = fVar432 - fVar223;
      fVar327 = fVar436 - fVar271;
      fVar340 = fVar440 - fVar326;
      fVar342 = fVar444 - fVar353;
      fVar422 = fVar224 - fVar390;
      fVar423 = fVar269 - fVar395;
      fVar424 = fVar272 - fVar396;
      fVar344 = fVar274 - fVar397;
      uVar141 = -(uint)(0.0 < (fVar391 * (fVar412 - fVar422) - fVar422 * (fVar343 - fVar391)) * 0.0
                              + (fVar422 * (fVar434 - fVar219) - (fVar412 - fVar422) * fVar219) *
                                0.0 + ((fVar343 - fVar391) * fVar219 - (fVar434 - fVar219) * fVar391
                                      ));
      uVar143 = -(uint)(0.0 < (fVar327 * (fVar382 - fVar423) - fVar423 * (fVar356 - fVar327)) * 0.0
                              + (fVar423 * (fVar439 - fVar268) - (fVar382 - fVar423) * fVar268) *
                                0.0 + ((fVar356 - fVar327) * fVar268 - (fVar439 - fVar268) * fVar327
                                      ));
      uVar142 = -(uint)(0.0 < (fVar340 * (fVar384 - fVar424) - fVar424 * (fVar361 - fVar340)) * 0.0
                              + (fVar424 * (fVar443 - fVar322) - (fVar384 - fVar424) * fVar322) *
                                0.0 + ((fVar361 - fVar340) * fVar322 - (fVar443 - fVar322) * fVar340
                                      ));
      uVar144 = -(uint)(0.0 < (fVar342 * (fVar386 - fVar344) - fVar344 * (fVar363 - fVar342)) * 0.0
                              + (fVar344 * (fVar447 - fVar338) - (fVar386 - fVar344) * fVar338) *
                                0.0 + ((fVar363 - fVar342) * fVar338 - (fVar447 - fVar338) * fVar342
                                      ));
      fVar365 = (float)((uint)(fVar367 - fVar225) & uVar141 | ~uVar141 & (uint)(fVar311 + fVar365));
      fVar367 = (float)((uint)(fVar370 - fVar270) & uVar143 | ~uVar143 & (uint)(fVar323 + fVar437));
      fVar370 = (float)((uint)(fVar372 - fVar273) & uVar142 | ~uVar142 & (uint)(fVar324 + fVar441));
      fVar372 = (float)((uint)(fVar374 - fVar275) & uVar144 | ~uVar144 & (uint)(fVar325 + fVar445));
      fVar410 = (float)((uint)(fVar355 - fVar410) & uVar141 | ~uVar141 & (uint)(fVar432 + fVar223));
      fVar411 = (float)((uint)(fVar360 - fVar411) & uVar143 | ~uVar143 & (uint)(fVar436 + fVar271));
      fVar413 = (float)((uint)(fVar362 - fVar413) & uVar142 | ~uVar142 & (uint)(fVar440 + fVar326));
      fVar420 = (float)((uint)(fVar364 - fVar420) & uVar144 | ~uVar144 & (uint)(fVar444 + fVar353));
      fVar376 = (float)((uint)(fVar148 - fVar376) & uVar141 | ~uVar141 & (uint)(fVar224 + fVar390));
      fVar383 = (float)((uint)(fVar217 - fVar383) & uVar143 | ~uVar143 & (uint)(fVar269 + fVar395));
      fVar385 = (float)((uint)(fVar220 - fVar385) & uVar142 | ~uVar142 & (uint)(fVar272 + fVar396));
      fVar387 = (float)((uint)(fVar222 - fVar387) & uVar144 | ~uVar144 & (uint)(fVar274 + fVar397));
      fVar223 = (float)((uint)fVar219 & uVar141 | ~uVar141 & (uint)fVar434);
      fVar271 = (float)((uint)fVar268 & uVar143 | ~uVar143 & (uint)fVar439);
      fVar326 = (float)((uint)fVar322 & uVar142 | ~uVar142 & (uint)fVar443);
      fVar353 = (float)((uint)fVar338 & uVar144 | ~uVar144 & (uint)fVar447);
      fVar311 = (float)((uint)fVar391 & uVar141 | ~uVar141 & (uint)fVar343);
      fVar323 = (float)((uint)fVar327 & uVar143 | ~uVar143 & (uint)fVar356);
      fVar324 = (float)((uint)fVar340 & uVar142 | ~uVar142 & (uint)fVar361);
      fVar325 = (float)((uint)fVar342 & uVar144 | ~uVar144 & (uint)fVar363);
      fVar355 = (float)((uint)fVar422 & uVar141 | ~uVar141 & (uint)fVar412);
      fVar360 = (float)((uint)fVar423 & uVar143 | ~uVar143 & (uint)fVar382);
      fVar362 = (float)((uint)fVar424 & uVar142 | ~uVar142 & (uint)fVar384);
      fVar364 = (float)((uint)fVar344 & uVar144 | ~uVar144 & (uint)fVar386);
      fVar434 = (float)((uint)fVar434 & uVar141 | ~uVar141 & (uint)fVar219) - fVar365;
      fVar439 = (float)((uint)fVar439 & uVar143 | ~uVar143 & (uint)fVar268) - fVar367;
      fVar443 = (float)((uint)fVar443 & uVar142 | ~uVar142 & (uint)fVar322) - fVar370;
      fVar447 = (float)((uint)fVar447 & uVar144 | ~uVar144 & (uint)fVar338) - fVar372;
      fVar391 = (float)((uint)fVar343 & uVar141 | ~uVar141 & (uint)fVar391) - fVar410;
      fVar327 = (float)((uint)fVar356 & uVar143 | ~uVar143 & (uint)fVar327) - fVar411;
      fVar340 = (float)((uint)fVar361 & uVar142 | ~uVar142 & (uint)fVar340) - fVar413;
      fVar342 = (float)((uint)fVar363 & uVar144 | ~uVar144 & (uint)fVar342) - fVar420;
      fVar412 = (float)((uint)fVar412 & uVar141 | ~uVar141 & (uint)fVar422) - fVar376;
      fVar382 = (float)((uint)fVar382 & uVar143 | ~uVar143 & (uint)fVar423) - fVar383;
      fVar384 = (float)((uint)fVar384 & uVar142 | ~uVar142 & (uint)fVar424) - fVar385;
      fVar386 = (float)((uint)fVar386 & uVar144 | ~uVar144 & (uint)fVar344) - fVar387;
      fVar374 = fVar365 - fVar223;
      fVar432 = fVar367 - fVar271;
      fVar436 = fVar370 - fVar326;
      fVar437 = fVar372 - fVar353;
      fVar422 = fVar410 - fVar311;
      fVar423 = fVar411 - fVar323;
      fVar424 = fVar413 - fVar324;
      fVar344 = fVar420 - fVar325;
      fVar219 = fVar376 - fVar355;
      fVar268 = fVar383 - fVar360;
      fVar322 = fVar385 - fVar362;
      fVar338 = fVar387 - fVar364;
      fVar343 = (fVar410 * fVar412 - fVar376 * fVar391) * 0.0 +
                (fVar376 * fVar434 - fVar365 * fVar412) * 0.0 +
                (fVar365 * fVar391 - fVar410 * fVar434);
      fVar356 = (fVar411 * fVar382 - fVar383 * fVar327) * 0.0 +
                (fVar383 * fVar439 - fVar367 * fVar382) * 0.0 +
                (fVar367 * fVar327 - fVar411 * fVar439);
      auVar313._4_4_ = fVar356;
      auVar313._0_4_ = fVar343;
      fVar361 = (fVar413 * fVar384 - fVar385 * fVar340) * 0.0 +
                (fVar385 * fVar443 - fVar370 * fVar384) * 0.0 +
                (fVar370 * fVar340 - fVar413 * fVar443);
      fVar363 = (fVar420 * fVar386 - fVar387 * fVar342) * 0.0 +
                (fVar387 * fVar447 - fVar372 * fVar386) * 0.0 +
                (fVar372 * fVar342 - fVar420 * fVar447);
      auVar426._0_4_ =
           (fVar311 * fVar219 - fVar355 * fVar422) * 0.0 +
           (fVar355 * fVar374 - fVar223 * fVar219) * 0.0 + (fVar223 * fVar422 - fVar311 * fVar374);
      auVar426._4_4_ =
           (fVar323 * fVar268 - fVar360 * fVar423) * 0.0 +
           (fVar360 * fVar432 - fVar271 * fVar268) * 0.0 + (fVar271 * fVar423 - fVar323 * fVar432);
      auVar426._8_4_ =
           (fVar324 * fVar322 - fVar362 * fVar424) * 0.0 +
           (fVar362 * fVar436 - fVar326 * fVar322) * 0.0 + (fVar326 * fVar424 - fVar324 * fVar436);
      auVar426._12_4_ =
           (fVar325 * fVar338 - fVar364 * fVar344) * 0.0 +
           (fVar364 * fVar437 - fVar353 * fVar338) * 0.0 + (fVar353 * fVar344 - fVar325 * fVar437);
      auVar313._8_4_ = fVar361;
      auVar313._12_4_ = fVar363;
      auVar175 = maxps(auVar313,auVar426);
      bVar91 = auVar175._0_4_ <= 0.0 && bVar91;
      auVar314._0_4_ = -(uint)bVar91;
      bVar92 = auVar175._4_4_ <= 0.0 && bVar92;
      auVar314._4_4_ = -(uint)bVar92;
      bVar90 = auVar175._8_4_ <= 0.0 && bVar90;
      auVar314._8_4_ = -(uint)bVar90;
      bVar89 = auVar175._12_4_ <= 0.0 && bVar89;
      auVar314._12_4_ = -(uint)bVar89;
      iVar212 = movmskps(iVar212,auVar314);
      if (iVar212 == 0) {
LAB_0036677e:
        auVar315._8_8_ = uStack_3d0;
        auVar315._0_8_ = local_3d8;
      }
      else {
        auVar333._0_4_ = fVar219 * fVar391;
        auVar333._4_4_ = fVar268 * fVar327;
        auVar333._8_4_ = fVar322 * fVar340;
        auVar333._12_4_ = fVar338 * fVar342;
        fVar311 = fVar422 * fVar412 - auVar333._0_4_;
        fVar323 = fVar423 * fVar382 - auVar333._4_4_;
        fVar324 = fVar424 * fVar384 - auVar333._8_4_;
        fVar325 = fVar344 * fVar386 - auVar333._12_4_;
        fVar219 = fVar219 * fVar434 - fVar412 * fVar374;
        fVar268 = fVar268 * fVar439 - fVar382 * fVar432;
        fVar322 = fVar322 * fVar443 - fVar384 * fVar436;
        fVar338 = fVar338 * fVar447 - fVar386 * fVar437;
        fVar412 = fVar374 * fVar391 - fVar422 * fVar434;
        fVar382 = fVar432 * fVar327 - fVar423 * fVar439;
        fVar384 = fVar436 * fVar340 - fVar424 * fVar443;
        fVar386 = fVar437 * fVar342 - fVar344 * fVar447;
        auVar348._0_4_ = fVar311 * 0.0 + fVar219 * 0.0 + fVar412;
        auVar348._4_4_ = fVar323 * 0.0 + fVar268 * 0.0 + fVar382;
        auVar348._8_4_ = fVar324 * 0.0 + fVar322 * 0.0 + fVar384;
        auVar348._12_4_ = fVar325 * 0.0 + fVar338 * 0.0 + fVar386;
        auVar175 = rcpps(auVar333,auVar348);
        fVar223 = auVar175._0_4_;
        fVar271 = auVar175._4_4_;
        fVar326 = auVar175._8_4_;
        fVar353 = auVar175._12_4_;
        fVar223 = (1.0 - auVar348._0_4_ * fVar223) * fVar223 + fVar223;
        fVar271 = (1.0 - auVar348._4_4_ * fVar271) * fVar271 + fVar271;
        fVar326 = (1.0 - auVar348._8_4_ * fVar326) * fVar326 + fVar326;
        fVar353 = (1.0 - auVar348._12_4_ * fVar353) * fVar353 + fVar353;
        fVar412 = (fVar376 * fVar412 + fVar410 * fVar219 + fVar365 * fVar311) * fVar223;
        fVar268 = (fVar383 * fVar382 + fVar411 * fVar268 + fVar367 * fVar323) * fVar271;
        aVar393.v[1] = fVar268;
        aVar393.v[0] = fVar412;
        fVar322 = (fVar385 * fVar384 + fVar413 * fVar322 + fVar370 * fVar324) * fVar326;
        fVar338 = (fVar387 * fVar386 + fVar420 * fVar338 + fVar372 * fVar325) * fVar353;
        fVar219 = *(float *)(ray + k * 4 + 0x80);
        bVar91 = (fVar412 <= fVar219 && fVar421 <= fVar412) && bVar91;
        auVar199._0_4_ = -(uint)bVar91;
        bVar92 = (fVar268 <= fVar219 && fVar421 <= fVar268) && bVar92;
        auVar199._4_4_ = -(uint)bVar92;
        bVar90 = (fVar322 <= fVar219 && fVar421 <= fVar322) && bVar90;
        auVar199._8_4_ = -(uint)bVar90;
        bVar89 = (fVar338 <= fVar219 && fVar421 <= fVar338) && bVar89;
        auVar199._12_4_ = -(uint)bVar89;
        iVar212 = movmskps(iVar212,auVar199);
        if (iVar212 == 0) goto LAB_0036677e;
        auVar200._0_8_ =
             CONCAT44(-(uint)(auVar348._4_4_ != 0.0 && bVar92),
                      -(uint)(auVar348._0_4_ != 0.0 && bVar91));
        auVar200._8_4_ = -(uint)(auVar348._8_4_ != 0.0 && bVar90);
        auVar200._12_4_ = -(uint)(auVar348._12_4_ != 0.0 && bVar89);
        iVar212 = movmskps(iVar212,auVar200);
        auVar315._8_8_ = uStack_3d0;
        auVar315._0_8_ = local_3d8;
        if (iVar212 != 0) {
          fVar343 = fVar343 * fVar223;
          fVar356 = fVar356 * fVar271;
          fVar361 = fVar361 * fVar326;
          fVar363 = fVar363 * fVar353;
          auVar249._0_4_ = ~uVar141 & (uint)fVar343;
          auVar249._4_4_ = ~uVar143 & (uint)fVar356;
          auVar249._8_4_ = ~uVar142 & (uint)fVar361;
          auVar249._12_4_ = ~uVar144 & (uint)fVar363;
          auVar406._0_4_ = (uint)(1.0 - fVar343) & uVar141;
          auVar406._4_4_ = (uint)(1.0 - fVar356) & uVar143;
          auVar406._8_4_ = (uint)(1.0 - fVar361) & uVar142;
          auVar406._12_4_ = (uint)(1.0 - fVar363) & uVar144;
          aVar407 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar406 | auVar249);
          local_278 = (float)(~uVar141 & (uint)(auVar426._0_4_ * fVar223) |
                             (uint)(1.0 - auVar426._0_4_ * fVar223) & uVar141);
          fStack_274 = (float)(~uVar143 & (uint)(auVar426._4_4_ * fVar271) |
                              (uint)(1.0 - auVar426._4_4_ * fVar271) & uVar143);
          fStack_270 = (float)(~uVar142 & (uint)(auVar426._8_4_ * fVar326) |
                              (uint)(1.0 - auVar426._8_4_ * fVar326) & uVar142);
          fStack_26c = (float)(~uVar144 & (uint)(auVar426._12_4_ * fVar353) |
                              (uint)(1.0 - auVar426._12_4_ * fVar353) & uVar144);
          auVar315._8_4_ = auVar200._8_4_;
          auVar315._0_8_ = auVar200._0_8_;
          auVar315._12_4_ = auVar200._12_4_;
          aVar393.v[2] = fVar322;
          aVar393.v[3] = fVar338;
          aVar392 = aVar393;
        }
      }
      iVar212 = movmskps(iVar212,auVar315);
      if (iVar212 != 0) {
        fVar219 = (auVar299._0_4_ - auVar404._0_4_) * aVar407.v[0] + auVar404._0_4_;
        fVar223 = (auVar299._4_4_ - auVar404._4_4_) * aVar407.v[1] + auVar404._4_4_;
        fVar268 = (auVar299._8_4_ - auVar404._8_4_) * aVar407.v[2] + auVar404._8_4_;
        fVar271 = (auVar299._12_4_ - auVar404._12_4_) * aVar407.v[3] + auVar404._12_4_;
        fVar421 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        fVar322 = aVar392.v[0];
        fVar326 = aVar392.v[1];
        fVar338 = aVar392.v[2];
        fVar353 = aVar392.v[3];
        aVar201._0_4_ = -(uint)(fVar421 * (fVar219 + fVar219) < fVar322) & auVar315._0_4_;
        aVar201._4_4_ = -(uint)(fVar421 * (fVar223 + fVar223) < fVar326) & auVar315._4_4_;
        aVar201._8_4_ = -(uint)(fVar421 * (fVar268 + fVar268) < fVar338) & auVar315._8_4_;
        aVar201._12_4_ = -(uint)(fVar421 * (fVar271 + fVar271) < fVar353) & auVar315._12_4_;
        iVar212 = movmskps((int)pre,(undefined1  [16])aVar201);
        if (iVar212 != 0) {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          bhit.i = 0;
          bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar345,fVar339);
          bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar359,fVar354);
          bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_3a4,local_3a8);
          bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar375,fStack_3a0);
          bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_3b4,local_3b8);
          bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar366,fStack_3b0);
          bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_3c4,local_3c8);
          bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar409,fStack_3c0);
          bhit.U.field_0 = aVar407;
          bhit.V.field_0.v[0] = local_278;
          bhit.V.field_0.v[1] = fStack_274;
          bhit.V.field_0.v[2] = fStack_270;
          bhit.V.field_0.v[3] = fStack_26c;
          bhit.T.field_0 = aVar392;
          bhit.N = iVar309;
          bhit.valid.field_0 = aVar201;
          if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            fVar421 = 1.0 / fVar147;
            bhit.vu.field_0.v[0] = fVar421 * (aVar407.v[0] + 0.0);
            bhit.vu.field_0.v[1] = fVar421 * (aVar407.v[1] + 1.0);
            bhit.vu.field_0.v[2] = fVar421 * (aVar407.v[2] + 2.0);
            bhit.vu.field_0.v[3] = fVar421 * (aVar407.v[3] + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
            bhit.vt.field_0 = aVar392;
            auVar250._0_4_ = aVar201._0_4_ & (uint)fVar322;
            auVar250._4_4_ = aVar201._4_4_ & (uint)fVar326;
            auVar250._8_4_ = aVar201._8_4_ & (uint)fVar338;
            auVar250._12_4_ = aVar201._12_4_ & (uint)fVar353;
            auVar300._0_8_ = CONCAT44(~aVar201._4_4_,~aVar201._0_4_) & 0x7f8000007f800000;
            auVar300._8_4_ = ~aVar201._8_4_ & 0x7f800000;
            auVar300._12_4_ = ~aVar201._12_4_ & 0x7f800000;
            auVar300 = auVar300 | auVar250;
            auVar316._4_4_ = auVar300._0_4_;
            auVar316._0_4_ = auVar300._4_4_;
            auVar316._8_4_ = auVar300._12_4_;
            auVar316._12_4_ = auVar300._8_4_;
            auVar175 = minps(auVar316,auVar300);
            auVar251._0_8_ = auVar175._8_8_;
            auVar251._8_4_ = auVar175._0_4_;
            auVar251._12_4_ = auVar175._4_4_;
            auVar175 = minps(auVar251,auVar175);
            auVar252._0_8_ =
                 CONCAT44(-(uint)(auVar175._4_4_ == auVar300._4_4_) & aVar201._4_4_,
                          -(uint)(auVar175._0_4_ == auVar300._0_4_) & aVar201._0_4_);
            auVar252._8_4_ = -(uint)(auVar175._8_4_ == auVar300._8_4_) & aVar201._8_4_;
            auVar252._12_4_ = -(uint)(auVar175._12_4_ == auVar300._12_4_) & aVar201._12_4_;
            iVar212 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar252);
            aVar202 = aVar201;
            if (iVar212 != 0) {
              aVar202.i[2] = auVar252._8_4_;
              aVar202._0_8_ = auVar252._0_8_;
              aVar202.i[3] = auVar252._12_4_;
            }
            uVar141 = movmskps(iVar212,(undefined1  [16])aVar202);
            lVar138 = 0;
            if (uVar141 != 0) {
              for (; (uVar141 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
              }
            }
            valid.field_0 = aVar201;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar421 = bhit.vu.field_0.v[lVar138];
              fVar219 = bhit.vv.field_0.v[lVar138];
              fVar223 = 1.0 - fVar421;
              fVar271 = fVar421 * fVar223 + fVar421 * fVar223;
              fVar268 = fVar223 * fVar223 * -3.0;
              fVar322 = (fVar223 * fVar223 - fVar271) * 3.0;
              fVar223 = (fVar271 - fVar421 * fVar421) * 3.0;
              fVar271 = fVar421 * fVar421 * 3.0;
              *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar138];
              *(float *)(ray + k * 4 + 0xc0) =
                   fVar268 * fVar339 +
                   fVar322 * local_3a8 + fVar223 * local_3b8 + fVar271 * local_3c8;
              *(float *)(ray + k * 4 + 0xd0) =
                   fVar268 * fVar345 +
                   fVar322 * fStack_3a4 + fVar223 * fStack_3b4 + fVar271 * fStack_3c4;
              *(float *)(ray + k * 4 + 0xe0) =
                   fVar268 * fVar354 +
                   fVar322 * fStack_3a0 + fVar223 * fStack_3b0 + fVar271 * fStack_3c0;
              *(float *)(ray + k * 4 + 0xf0) = fVar421;
              *(float *)(ray + k * 4 + 0x100) = fVar219;
              *(uint *)(ray + k * 4 + 0x110) = uVar140;
              *(uint *)(ray + k * 4 + 0x120) = uVar139;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              pRVar132 = (RTCIntersectArguments *)context;
            }
            else {
              local_4a8 = CONCAT44(uVar140,uVar140);
              uStack_4a0._0_4_ = uVar140;
              uStack_4a0._4_4_ = uVar140;
              auVar175 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar131);
              _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              while( true ) {
                local_d8 = bhit.vu.field_0.v[lVar138];
                local_c8 = bhit.vv.field_0.v[lVar138];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar138];
                fVar421 = 1.0 - local_d8;
                fVar223 = local_d8 * fVar421 + local_d8 * fVar421;
                fVar268 = (fVar223 - local_d8 * local_d8) * 3.0;
                fVar219 = local_d8 * local_d8 * 3.0;
                fVar223 = (fVar421 * fVar421 - fVar223) * 3.0;
                args.context = context->user;
                fVar421 = fVar421 * fVar421 * -3.0;
                local_108 = fVar421 * fVar339 +
                            fVar223 * local_3a8 + fVar268 * local_3b8 + fVar219 * local_3c8;
                local_f8 = fVar421 * fVar345 +
                           fVar223 * fStack_3a4 + fVar268 * fStack_3b4 + fVar219 * fStack_3c4;
                local_e8 = fVar421 * fVar354 +
                           fVar223 * fStack_3a0 + fVar268 * fStack_3b0 + fVar219 * fStack_3c0;
                fStack_104 = local_108;
                fStack_100 = local_108;
                fStack_fc = local_108;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                fStack_d4 = local_d8;
                fStack_d0 = local_d8;
                fStack_cc = local_d8;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                local_b8 = local_4a8;
                uStack_b0 = uStack_4a0;
                local_a8 = CONCAT44(uVar139,uVar139);
                uStack_a0 = CONCAT44(uVar139,uVar139);
                local_98 = (args.context)->instID[0];
                uStack_94 = local_98;
                uStack_90 = local_98;
                uStack_8c = local_98;
                local_88 = (args.context)->instPrimID[0];
                uStack_84 = local_88;
                uStack_80 = local_88;
                uStack_7c = local_88;
                args.valid = (int *)local_3f8;
                pRVar132 = (RTCIntersectArguments *)pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_108;
                args.N = 4;
                p_Var127 = pGVar26->intersectionFilterN;
                auVar448._8_8_ = pGVar133;
                auVar448._0_8_ = p_Var127;
                local_3f8 = auVar175;
                args.geometryUserPtr = pRVar132;
                args.ray = (RTCRayN *)ray;
                if (p_Var127 != (RTCFilterFunctionN)0x0) {
                  auVar448 = (*p_Var127)(&args);
                }
                pGVar133 = auVar448._8_8_;
                auVar263._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                auVar263._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                auVar263._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                auVar263._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                uVar141 = movmskps(auVar448._0_4_,auVar263);
                pRVar128 = (RTCRayN *)(ulong)(uVar141 ^ 0xf);
                if ((uVar141 ^ 0xf) == 0) {
                  auVar263 = auVar263 ^ _DAT_01f46b70;
                }
                else {
                  pRVar132 = context->args;
                  pRVar129 = (RTCIntersectArguments *)pRVar132->filter;
                  auVar125._8_8_ = pGVar133;
                  auVar125._0_8_ = pRVar129;
                  auVar449._8_8_ = pGVar133;
                  auVar449._0_8_ = pRVar129;
                  if ((pRVar129 != (RTCIntersectArguments *)0x0) &&
                     ((((ulong)*(Scene **)&pRVar132->flags & 2) != 0 ||
                      (auVar449 = auVar125, ((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar449 = (*(code *)pRVar129)(&args);
                  }
                  pGVar133 = auVar449._8_8_;
                  auVar208._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                  auVar208._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                  auVar208._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                  auVar208._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                  auVar263 = auVar208 ^ _DAT_01f46b70;
                  uVar141 = movmskps(auVar449._0_4_,auVar208);
                  pRVar128 = (RTCRayN *)(ulong)(uVar141 ^ 0xf);
                  if ((uVar141 ^ 0xf) != 0) {
                    uVar141 = *(uint *)(args.hit + 4);
                    uVar143 = *(uint *)(args.hit + 8);
                    uVar142 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar208._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar208._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar208._4_4_ & uVar141 | *(uint *)(args.ray + 0xc4) & auVar208._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar208._8_4_ & uVar143 | *(uint *)(args.ray + 200) & auVar208._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar208._12_4_ & uVar142 | *(uint *)(args.ray + 0xcc) & auVar208._12_4_;
                    uVar141 = *(uint *)(args.hit + 0x14);
                    uVar143 = *(uint *)(args.hit + 0x18);
                    uVar142 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar208._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar208._4_4_ & uVar141 | *(uint *)(args.ray + 0xd4) & auVar208._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar208._8_4_ & uVar143 | *(uint *)(args.ray + 0xd8) & auVar208._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar208._12_4_ & uVar142 | *(uint *)(args.ray + 0xdc) & auVar208._12_4_;
                    uVar141 = *(uint *)(args.hit + 0x24);
                    uVar143 = *(uint *)(args.hit + 0x28);
                    uVar142 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar208._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar208._4_4_ & uVar141 | *(uint *)(args.ray + 0xe4) & auVar208._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar208._8_4_ & uVar143 | *(uint *)(args.ray + 0xe8) & auVar208._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar208._12_4_ & uVar142 | *(uint *)(args.ray + 0xec) & auVar208._12_4_;
                    uVar141 = *(uint *)(args.hit + 0x34);
                    uVar143 = *(uint *)(args.hit + 0x38);
                    uVar142 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar208._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar208._4_4_ & uVar141 | *(uint *)(args.ray + 0xf4) & auVar208._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar208._8_4_ & uVar143 | *(uint *)(args.ray + 0xf8) & auVar208._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar208._12_4_ & uVar142 | *(uint *)(args.ray + 0xfc) & auVar208._12_4_;
                    uVar141 = *(uint *)(args.hit + 0x44);
                    uVar143 = *(uint *)(args.hit + 0x48);
                    uVar142 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar208._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar208._4_4_ & uVar141 | *(uint *)(args.ray + 0x104) & auVar208._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar208._8_4_ & uVar143 | *(uint *)(args.ray + 0x108) & auVar208._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar208._12_4_ & uVar142 | *(uint *)(args.ray + 0x10c) & auVar208._12_4_;
                    uVar141 = *(uint *)(args.hit + 0x54);
                    uVar143 = *(uint *)(args.hit + 0x58);
                    uVar142 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar208._0_4_ |
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar208._4_4_ | ~auVar208._4_4_ & uVar141;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar208._8_4_ | ~auVar208._8_4_ & uVar143;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar208._12_4_ | ~auVar208._12_4_ & uVar142;
                    uVar141 = *(uint *)(args.hit + 100);
                    uVar143 = *(uint *)(args.hit + 0x68);
                    uVar142 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar208._0_4_ |
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar208._4_4_ | ~auVar208._4_4_ & uVar141;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar208._8_4_ | ~auVar208._8_4_ & uVar143;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar208._12_4_ | ~auVar208._12_4_ & uVar142;
                    uVar141 = *(uint *)(args.hit + 0x74);
                    uVar143 = *(uint *)(args.hit + 0x78);
                    uVar142 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar208._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar208._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar208._4_4_ & uVar141 | *(uint *)(args.ray + 0x134) & auVar208._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar208._8_4_ & uVar143 | *(uint *)(args.ray + 0x138) & auVar208._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar208._12_4_ & uVar142 | *(uint *)(args.ray + 0x13c) & auVar208._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar208 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar208;
                    pRVar128 = args.ray;
                    pRVar132 = (RTCIntersectArguments *)args.hit;
                  }
                }
                auVar264._0_4_ = auVar263._0_4_ << 0x1f;
                auVar264._4_4_ = auVar263._4_4_ << 0x1f;
                auVar264._8_4_ = auVar263._8_4_ << 0x1f;
                auVar264._12_4_ = auVar263._12_4_ << 0x1f;
                iVar212 = movmskps((int)pRVar128,auVar264);
                if (iVar212 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                }
                else {
                  local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_518._4_4_ = 0;
                  fStack_510 = 0.0;
                  uStack_50c = 0;
                }
                *(undefined4 *)(local_3f8 + lVar138 * 4 + -0x10) = 0;
                valid.field_0.i[0] = -(uint)(fVar322 <= (float)local_518._0_4_) & valid.field_0.i[0]
                ;
                valid.field_0.i[1] = -(uint)(fVar326 <= (float)local_518._0_4_) & valid.field_0.i[1]
                ;
                valid.field_0.i[2] = -(uint)(fVar338 <= (float)local_518._0_4_) & valid.field_0.i[2]
                ;
                valid.field_0.i[3] = -(uint)(fVar353 <= (float)local_518._0_4_) & valid.field_0.i[3]
                ;
                iVar212 = movmskps(iVar212,(undefined1  [16])valid.field_0);
                if (iVar212 == 0) break;
                auVar265._0_4_ = valid.field_0.i[0] & (uint)fVar322;
                auVar265._4_4_ = valid.field_0.i[1] & (uint)fVar326;
                auVar265._8_4_ = valid.field_0.i[2] & (uint)fVar338;
                auVar265._12_4_ = valid.field_0.i[3] & (uint)fVar353;
                auVar306._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar306._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar306._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar306 = auVar306 | auVar265;
                auVar321._4_4_ = auVar306._0_4_;
                auVar321._0_4_ = auVar306._4_4_;
                auVar321._8_4_ = auVar306._12_4_;
                auVar321._12_4_ = auVar306._8_4_;
                auVar226 = minps(auVar321,auVar306);
                auVar266._0_8_ = auVar226._8_8_;
                auVar266._8_4_ = auVar226._0_4_;
                auVar266._12_4_ = auVar226._4_4_;
                auVar226 = minps(auVar266,auVar226);
                auVar267._0_8_ =
                     CONCAT44(-(uint)(auVar226._4_4_ == auVar306._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar226._0_4_ == auVar306._0_4_) & valid.field_0.i[0]);
                auVar267._8_4_ = -(uint)(auVar226._8_4_ == auVar306._8_4_) & valid.field_0.i[2];
                auVar267._12_4_ = -(uint)(auVar226._12_4_ == auVar306._12_4_) & valid.field_0.i[3];
                iVar212 = movmskps(iVar212,auVar267);
                aVar209 = valid.field_0;
                if (iVar212 != 0) {
                  aVar209.i[2] = auVar267._8_4_;
                  aVar209._0_8_ = auVar267._0_8_;
                  aVar209.i[3] = auVar267._12_4_;
                }
                uVar135 = movmskps(iVar212,(undefined1  [16])aVar209);
                uVar130 = CONCAT44((int)((ulong)pRVar128 >> 0x20),uVar135);
                lVar138 = 0;
                if (uVar130 != 0) {
                  for (; (uVar130 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar135 = SUB84(pRVar132,0);
    if (4 < iVar309) {
      local_58 = iVar309;
      iStack_54 = iVar309;
      iStack_50 = iVar309;
      iStack_4c = iVar309;
      local_398._4_4_ = local_398._0_4_;
      fStack_390 = (float)local_398._0_4_;
      fStack_38c = (float)local_398._0_4_;
      local_78 = 1.0 / fVar147;
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      local_68 = uVar139;
      uStack_64 = uVar139;
      uStack_60 = uVar139;
      uStack_5c = uVar139;
      local_2e8 = CONCAT44(uVar140,uVar140);
      uStack_2e0._0_4_ = uVar140;
      uStack_2e0._4_4_ = uVar140;
      for (lVar138 = 4; uVar135 = SUB84(pRVar132,0), lVar138 < iVar309; lVar138 = lVar138 + 4) {
        uVar141 = (uint)lVar138;
        pRVar132 = (RTCIntersectArguments *)(bezier_basis0 + lVar134);
        pfVar2 = (float *)((long)&pRVar132->flags + lVar138 * 4);
        fVar421 = *pfVar2;
        fVar147 = pfVar2[1];
        fVar219 = pfVar2[2];
        fVar223 = pfVar2[3];
        pfVar2 = (float *)(lVar134 + 0x21fb768 + lVar138 * 4);
        fVar268 = *pfVar2;
        fVar271 = pfVar2[1];
        fVar322 = pfVar2[2];
        fVar326 = pfVar2[3];
        pauVar8 = (undefined1 (*) [12])(lVar134 + 0x21fbbec + lVar138 * 4);
        fVar338 = *(float *)*pauVar8;
        fVar353 = *(float *)(*pauVar8 + 4);
        fVar412 = *(float *)(*pauVar8 + 8);
        auVar62 = *pauVar8;
        fVar382 = *(float *)pauVar8[1];
        pfVar2 = (float *)(lVar134 + 0x21fc070 + lVar138 * 4);
        fVar384 = *pfVar2;
        fVar386 = pfVar2[1];
        fVar410 = pfVar2[2];
        fVar411 = pfVar2[3];
        fVar361 = fVar369 * fVar421 + fVar435 * fVar268 + fVar419 * fVar338 + fVar211 * fVar384;
        fVar362 = fVar369 * fVar147 + fVar435 * fVar271 + fVar419 * fVar353 + fVar211 * fVar386;
        fVar363 = fVar369 * fVar219 + fVar435 * fVar322 + fVar419 * fVar412 + fVar211 * fVar410;
        fVar364 = fVar369 * fVar223 + fVar435 * fVar326 + fVar419 * fVar382 + fVar211 * fVar411;
        fVar365 = fVar394 * fVar421 + fVar371 * fVar268 + fVar402 * fVar338 + fVar216 * fVar384;
        fVar370 = fVar394 * fVar147 + fVar371 * fVar271 + fVar402 * fVar353 + fVar216 * fVar386;
        fVar374 = fVar394 * fVar219 + fVar371 * fVar322 + fVar402 * fVar412 + fVar216 * fVar410;
        fVar436 = fVar394 * fVar223 + fVar371 * fVar326 + fVar402 * fVar382 + fVar216 * fVar411;
        auVar254._0_4_ =
             fVar359 * fVar421 + fVar375 * fVar268 + fVar366 * fVar338 + fVar409 * fVar384;
        auVar254._4_4_ =
             fVar359 * fVar147 + fVar375 * fVar271 + fVar366 * fVar353 + fVar409 * fVar386;
        auVar254._8_4_ =
             fVar359 * fVar219 + fVar375 * fVar322 + fVar366 * fVar412 + fVar409 * fVar410;
        auVar254._12_4_ =
             fVar359 * fVar223 + fVar375 * fVar326 + fVar366 * fVar382 + fVar409 * fVar411;
        pfVar2 = (float *)(bezier_basis1 + lVar134 + lVar138 * 4);
        fVar338 = *pfVar2;
        fVar353 = pfVar2[1];
        fVar412 = pfVar2[2];
        fVar413 = pfVar2[3];
        pfVar2 = (float *)(lVar134 + 0x21fdb88 + lVar138 * 4);
        fVar420 = *pfVar2;
        fVar422 = pfVar2[1];
        fVar423 = pfVar2[2];
        fVar424 = pfVar2[3];
        pfVar2 = (float *)(lVar134 + 0x21fe00c + lVar138 * 4);
        fVar344 = *pfVar2;
        fVar434 = pfVar2[1];
        fVar439 = pfVar2[2];
        fVar443 = pfVar2[3];
        pauVar8 = (undefined1 (*) [12])(lVar134 + 0x21fe490 + lVar138 * 4);
        fVar447 = *(float *)*pauVar8;
        fVar376 = *(float *)(*pauVar8 + 4);
        fVar383 = *(float *)(*pauVar8 + 8);
        auVar65 = *pauVar8;
        fVar385 = *(float *)pauVar8[1];
        fVar391 = fVar369 * fVar338 + fVar435 * fVar420 + fVar419 * fVar344 + fVar211 * fVar447;
        fVar323 = fVar369 * fVar353 + fVar435 * fVar422 + fVar419 * fVar434 + fVar211 * fVar376;
        fVar325 = fVar369 * fVar412 + fVar435 * fVar423 + fVar419 * fVar439 + fVar211 * fVar383;
        fVar340 = fVar369 * fVar413 + fVar435 * fVar424 + fVar419 * fVar443 + fVar211 * fVar385;
        fVar343 = fVar394 * fVar338 + fVar371 * fVar420 + fVar402 * fVar344 + fVar216 * fVar447;
        fVar355 = fVar394 * fVar353 + fVar371 * fVar422 + fVar402 * fVar434 + fVar216 * fVar376;
        fVar356 = fVar394 * fVar412 + fVar371 * fVar423 + fVar402 * fVar439 + fVar216 * fVar383;
        fVar360 = fVar394 * fVar413 + fVar371 * fVar424 + fVar402 * fVar443 + fVar216 * fVar385;
        auVar427._0_4_ =
             fVar359 * fVar338 + fVar375 * fVar420 + fVar366 * fVar344 + fVar409 * fVar447;
        auVar427._4_4_ =
             fVar359 * fVar353 + fVar375 * fVar422 + fVar366 * fVar434 + fVar409 * fVar376;
        auVar427._8_4_ =
             fVar359 * fVar412 + fVar375 * fVar423 + fVar366 * fVar439 + fVar409 * fVar383;
        auVar427._12_4_ =
             fVar359 * fVar413 + fVar375 * fVar424 + fVar366 * fVar443 + fVar409 * fVar385;
        fVar311 = fVar391 - fVar361;
        fVar324 = fVar323 - fVar362;
        fVar327 = fVar325 - fVar363;
        fVar342 = fVar340 - fVar364;
        fVar447 = fVar343 - fVar365;
        fVar376 = fVar355 - fVar370;
        fVar383 = fVar356 - fVar374;
        fVar387 = fVar360 - fVar436;
        fVar367 = fVar365 * fVar311 - fVar361 * fVar447;
        fVar372 = fVar370 * fVar324 - fVar362 * fVar376;
        fVar432 = fVar374 * fVar327 - fVar363 * fVar383;
        fVar437 = fVar436 * fVar342 - fVar364 * fVar387;
        auVar175 = maxps(auVar254,auVar427);
        bVar89 = fVar367 * fVar367 <=
                 auVar175._0_4_ * auVar175._0_4_ * (fVar311 * fVar311 + fVar447 * fVar447) &&
                 (int)uVar141 < local_58;
        auVar368._0_4_ = -(uint)bVar89;
        bVar90 = fVar372 * fVar372 <=
                 auVar175._4_4_ * auVar175._4_4_ * (fVar324 * fVar324 + fVar376 * fVar376) &&
                 (int)(uVar141 | 1) < iStack_54;
        auVar368._4_4_ = -(uint)bVar90;
        bVar91 = fVar432 * fVar432 <=
                 auVar175._8_4_ * auVar175._8_4_ * (fVar327 * fVar327 + fVar383 * fVar383) &&
                 (int)(uVar141 | 2) < iStack_50;
        auVar368._8_4_ = -(uint)bVar91;
        bVar92 = fVar437 * fVar437 <=
                 auVar175._12_4_ * auVar175._12_4_ * (fVar342 * fVar342 + fVar387 * fVar387) &&
                 (int)(uVar141 | 3) < iStack_4c;
        auVar368._12_4_ = -(uint)bVar92;
        uVar139 = movmskps((int)pGVar133,auVar368);
        pGVar133 = (Geometry *)(ulong)uVar139;
        if (uVar139 != 0) {
          local_518._0_4_ = auVar65._0_4_;
          local_518._4_4_ = auVar65._4_4_;
          fStack_510 = auVar65._8_4_;
          fVar444 = (float)local_518._0_4_ * fVar146 + fVar344 * fVar341 + fVar420 * fVar373 +
                    fVar338 * fVar401;
          fVar445 = (float)local_518._4_4_ * fVar146 + fVar434 * fVar341 + fVar422 * fVar373 +
                    fVar353 * fVar401;
          fVar148 = fStack_510 * fVar146 + fVar439 * fVar341 + fVar423 * fVar373 + fVar412 * fVar401
          ;
          fVar217 = fVar385 * fVar146 + fVar443 * fVar341 + fVar424 * fVar373 + fVar413 * fVar401;
          local_348 = auVar62._0_4_;
          fStack_344 = auVar62._4_4_;
          fStack_340 = auVar62._8_4_;
          fVar269 = fVar384 * fVar146 + local_348 * fVar341 + fVar268 * fVar373 + fVar421 * fVar401;
          fVar270 = fVar386 * fVar146 + fStack_344 * fVar341 + fVar271 * fVar373 + fVar147 * fVar401
          ;
          fVar272 = fVar410 * fVar146 + fStack_340 * fVar341 + fVar322 * fVar373 + fVar219 * fVar401
          ;
          fVar273 = fVar411 * fVar146 + fVar382 * fVar341 + fVar326 * fVar373 + fVar223 * fVar401;
          pfVar2 = (float *)(lVar134 + 0x21fc4f4 + lVar138 * 4);
          fVar421 = *pfVar2;
          fVar147 = pfVar2[1];
          fVar219 = pfVar2[2];
          fVar223 = pfVar2[3];
          pfVar2 = (float *)(lVar134 + 0x21fc978 + lVar138 * 4);
          fVar268 = *pfVar2;
          fVar271 = pfVar2[1];
          fVar322 = pfVar2[2];
          fVar326 = pfVar2[3];
          pfVar2 = (float *)(lVar134 + 0x21fcdfc + lVar138 * 4);
          fVar338 = *pfVar2;
          fVar353 = pfVar2[1];
          fVar412 = pfVar2[2];
          fVar382 = pfVar2[3];
          pfVar2 = (float *)(lVar134 + 0x21fd280 + lVar138 * 4);
          fVar384 = *pfVar2;
          fVar386 = pfVar2[1];
          fVar410 = pfVar2[2];
          fVar411 = pfVar2[3];
          fVar396 = fVar369 * fVar421 + fVar435 * fVar268 + fVar419 * fVar338 + fVar211 * fVar384;
          fVar397 = fVar369 * fVar147 + fVar435 * fVar271 + fVar419 * fVar353 + fVar211 * fVar386;
          fVar425 = fVar369 * fVar219 + fVar435 * fVar322 + fVar419 * fVar412 + fVar211 * fVar410;
          fVar429 = fVar369 * fVar223 + fVar435 * fVar326 + fVar419 * fVar382 + fVar211 * fVar411;
          fVar220 = fVar394 * fVar421 + fVar371 * fVar268 + fVar402 * fVar338 + fVar216 * fVar384;
          fVar222 = fVar394 * fVar147 + fVar371 * fVar271 + fVar402 * fVar353 + fVar216 * fVar386;
          fVar224 = fVar394 * fVar219 + fVar371 * fVar322 + fVar402 * fVar412 + fVar216 * fVar410;
          fVar225 = fVar394 * fVar223 + fVar371 * fVar326 + fVar402 * fVar382 + fVar216 * fVar411;
          pfVar2 = (float *)(lVar134 + 0x21fe914 + lVar138 * 4);
          fVar413 = *pfVar2;
          fVar420 = pfVar2[1];
          fVar422 = pfVar2[2];
          fVar423 = pfVar2[3];
          pfVar2 = (float *)(lVar134 + 0x21ff21c + lVar138 * 4);
          fVar424 = *pfVar2;
          fVar344 = pfVar2[1];
          fVar434 = pfVar2[2];
          fVar439 = pfVar2[3];
          pfVar2 = (float *)(lVar134 + 0x21ff6a0 + lVar138 * 4);
          fVar443 = *pfVar2;
          fVar385 = pfVar2[1];
          fVar367 = pfVar2[2];
          fVar372 = pfVar2[3];
          pfVar2 = (float *)(lVar134 + 0x21fed98 + lVar138 * 4);
          fVar432 = *pfVar2;
          fVar437 = pfVar2[1];
          fVar440 = pfVar2[2];
          fVar441 = pfVar2[3];
          fVar430 = fVar369 * fVar413 + fVar435 * fVar432 + fVar419 * fVar424 + fVar211 * fVar443;
          fVar431 = fVar369 * fVar420 + fVar435 * fVar437 + fVar419 * fVar344 + fVar211 * fVar385;
          fVar433 = fVar369 * fVar422 + fVar435 * fVar440 + fVar419 * fVar434 + fVar211 * fVar367;
          fVar438 = fVar369 * fVar423 + fVar435 * fVar441 + fVar419 * fVar439 + fVar211 * fVar372;
          fVar274 = fVar394 * fVar413 + fVar371 * fVar432 + fVar402 * fVar424 + fVar216 * fVar443;
          fVar275 = fVar394 * fVar420 + fVar371 * fVar437 + fVar402 * fVar344 + fVar216 * fVar385;
          fVar390 = fVar394 * fVar422 + fVar371 * fVar440 + fVar402 * fVar434 + fVar216 * fVar367;
          fVar395 = fVar394 * fVar423 + fVar371 * fVar441 + fVar402 * fVar439 + fVar216 * fVar372;
          auVar408._0_8_ = CONCAT44(fVar397,fVar396) & 0x7fffffff7fffffff;
          auVar408._8_4_ = ABS(fVar425);
          auVar408._12_4_ = ABS(fVar429);
          auVar349._0_8_ = CONCAT44(fVar222,fVar220) & 0x7fffffff7fffffff;
          auVar349._8_4_ = ABS(fVar224);
          auVar349._12_4_ = ABS(fVar225);
          auVar175 = maxps(auVar408,auVar349);
          auVar417._0_8_ =
               CONCAT44(fVar147 * fVar401 +
                        fVar271 * fVar373 + fVar353 * fVar341 + fVar386 * fVar146,
                        fVar421 * fVar401 +
                        fVar268 * fVar373 + fVar338 * fVar341 + fVar384 * fVar146) &
               0x7fffffff7fffffff;
          auVar417._8_4_ =
               ABS(fVar219 * fVar401 + fVar322 * fVar373 + fVar412 * fVar341 + fVar410 * fVar146);
          auVar417._12_4_ =
               ABS(fVar223 * fVar401 + fVar326 * fVar373 + fVar382 * fVar341 + fVar411 * fVar146);
          auVar175 = maxps(auVar175,auVar417);
          uVar139 = -(uint)(local_488 <= auVar175._0_4_);
          uVar143 = -(uint)(local_488 <= auVar175._4_4_);
          uVar142 = -(uint)(local_488 <= auVar175._8_4_);
          uVar144 = -(uint)(local_488 <= auVar175._12_4_);
          auVar350._0_4_ = ~uVar139 & (uint)fVar311;
          auVar350._4_4_ = ~uVar143 & (uint)fVar324;
          auVar350._8_4_ = ~uVar142 & (uint)fVar327;
          auVar350._12_4_ = ~uVar144 & (uint)fVar342;
          auVar400._0_4_ = (uint)fVar396 & uVar139;
          auVar400._4_4_ = (uint)fVar397 & uVar143;
          auVar400._8_4_ = (uint)fVar425 & uVar142;
          auVar400._12_4_ = (uint)fVar429 & uVar144;
          auVar400 = auVar400 | auVar350;
          fVar220 = (float)(~uVar139 & (uint)fVar447 | (uint)fVar220 & uVar139);
          fVar222 = (float)(~uVar143 & (uint)fVar376 | (uint)fVar222 & uVar143);
          fVar224 = (float)(~uVar142 & (uint)fVar383 | (uint)fVar224 & uVar142);
          fVar225 = (float)(~uVar144 & (uint)fVar387 | (uint)fVar225 & uVar144);
          auVar418._0_8_ = CONCAT44(fVar431,fVar430) & 0x7fffffff7fffffff;
          auVar418._8_4_ = ABS(fVar433);
          auVar418._12_4_ = ABS(fVar438);
          auVar301._0_8_ = CONCAT44(fVar275,fVar274) & 0x7fffffff7fffffff;
          auVar301._8_4_ = ABS(fVar390);
          auVar301._12_4_ = ABS(fVar395);
          auVar175 = maxps(auVar418,auVar301);
          auVar203._0_8_ =
               CONCAT44(fVar420 * fVar401 +
                        fVar437 * fVar373 + fVar344 * fVar341 + fVar385 * fVar146,
                        fVar413 * fVar401 +
                        fVar432 * fVar373 + fVar424 * fVar341 + fVar443 * fVar146) &
               0x7fffffff7fffffff;
          auVar203._8_4_ =
               ABS(fVar422 * fVar401 + fVar440 * fVar373 + fVar434 * fVar341 + fVar367 * fVar146);
          auVar203._12_4_ =
               ABS(fVar423 * fVar401 + fVar441 * fVar373 + fVar439 * fVar341 + fVar372 * fVar146);
          auVar175 = maxps(auVar175,auVar203);
          uVar139 = -(uint)(local_488 <= auVar175._0_4_);
          uVar143 = -(uint)(local_488 <= auVar175._4_4_);
          uVar142 = -(uint)(local_488 <= auVar175._8_4_);
          uVar144 = -(uint)(local_488 <= auVar175._12_4_);
          fVar443 = (float)((uint)fVar430 & uVar139 | ~uVar139 & (uint)fVar311);
          fVar385 = (float)((uint)fVar431 & uVar143 | ~uVar143 & (uint)fVar324);
          fVar311 = (float)((uint)fVar433 & uVar142 | ~uVar142 & (uint)fVar327);
          fVar437 = (float)((uint)fVar438 & uVar144 | ~uVar144 & (uint)fVar342);
          fVar413 = (float)(~uVar139 & (uint)fVar447 | (uint)fVar274 & uVar139);
          fVar422 = (float)(~uVar143 & (uint)fVar376 | (uint)fVar275 & uVar143);
          fVar424 = (float)(~uVar142 & (uint)fVar383 | (uint)fVar390 & uVar142);
          fVar434 = (float)(~uVar144 & (uint)fVar387 | (uint)fVar395 & uVar144);
          fVar326 = auVar400._0_4_;
          fVar421 = auVar400._4_4_;
          fVar147 = auVar400._8_4_;
          fVar219 = auVar400._12_4_;
          auVar334._0_4_ = fVar220 * fVar220 + fVar326 * fVar326;
          auVar334._4_4_ = fVar222 * fVar222 + fVar421 * fVar421;
          auVar334._8_4_ = fVar224 * fVar224 + fVar147 * fVar147;
          auVar334._12_4_ = fVar225 * fVar225 + fVar219 * fVar219;
          auVar175 = rsqrtps(auVar350,auVar334);
          fVar223 = auVar175._0_4_;
          fVar268 = auVar175._4_4_;
          fVar271 = auVar175._8_4_;
          fVar322 = auVar175._12_4_;
          auVar351._0_4_ = fVar223 * fVar223 * auVar334._0_4_ * 0.5 * fVar223;
          auVar351._4_4_ = fVar268 * fVar268 * auVar334._4_4_ * 0.5 * fVar268;
          auVar351._8_4_ = fVar271 * fVar271 * auVar334._8_4_ * 0.5 * fVar271;
          auVar351._12_4_ = fVar322 * fVar322 * auVar334._12_4_ * 0.5 * fVar322;
          fVar384 = fVar223 * 1.5 - auVar351._0_4_;
          fVar386 = fVar268 * 1.5 - auVar351._4_4_;
          fVar410 = fVar271 * 1.5 - auVar351._8_4_;
          fVar411 = fVar322 * 1.5 - auVar351._12_4_;
          auVar335._0_4_ = fVar413 * fVar413 + fVar443 * fVar443;
          auVar335._4_4_ = fVar422 * fVar422 + fVar385 * fVar385;
          auVar335._8_4_ = fVar424 * fVar424 + fVar311 * fVar311;
          auVar335._12_4_ = fVar434 * fVar434 + fVar437 * fVar437;
          auVar175 = rsqrtps(auVar351,auVar335);
          fVar223 = auVar175._0_4_;
          fVar268 = auVar175._4_4_;
          fVar271 = auVar175._8_4_;
          fVar322 = auVar175._12_4_;
          fVar338 = fVar223 * 1.5 - fVar223 * fVar223 * auVar335._0_4_ * 0.5 * fVar223;
          fVar353 = fVar268 * 1.5 - fVar268 * fVar268 * auVar335._4_4_ * 0.5 * fVar268;
          fVar412 = fVar271 * 1.5 - fVar271 * fVar271 * auVar335._8_4_ * 0.5 * fVar271;
          fVar382 = fVar322 * 1.5 - fVar322 * fVar322 * auVar335._12_4_ * 0.5 * fVar322;
          fVar447 = fVar220 * fVar384 * auVar254._0_4_;
          fVar383 = fVar222 * fVar386 * auVar254._4_4_;
          fVar387 = fVar224 * fVar410 * auVar254._8_4_;
          fVar327 = fVar225 * fVar411 * auVar254._12_4_;
          fVar268 = -fVar326 * fVar384 * auVar254._0_4_;
          fVar271 = -fVar421 * fVar386 * auVar254._4_4_;
          fVar322 = -fVar147 * fVar410 * auVar254._8_4_;
          fVar326 = -fVar219 * fVar411 * auVar254._12_4_;
          fVar420 = fVar384 * 0.0 * auVar254._0_4_;
          fVar423 = fVar386 * 0.0 * auVar254._4_4_;
          fVar344 = fVar410 * 0.0 * auVar254._8_4_;
          fVar439 = fVar411 * 0.0 * auVar254._12_4_;
          fVar324 = fVar413 * fVar338 * auVar427._0_4_;
          fVar275 = fVar422 * fVar353 * auVar427._4_4_;
          fVar390 = fVar424 * fVar412 * auVar427._8_4_;
          fVar395 = fVar434 * fVar382 * auVar427._12_4_;
          fVar342 = fVar391 + fVar324;
          fVar367 = fVar323 + fVar275;
          fVar372 = fVar325 + fVar390;
          fVar432 = fVar340 + fVar395;
          fVar421 = -fVar443 * fVar338 * auVar427._0_4_;
          fVar147 = -fVar385 * fVar353 * auVar427._4_4_;
          fVar219 = -fVar311 * fVar412 * auVar427._8_4_;
          fVar223 = -fVar437 * fVar382 * auVar427._12_4_;
          fVar437 = fVar343 + fVar421;
          fVar440 = fVar355 + fVar147;
          fVar441 = fVar356 + fVar219;
          fVar220 = fVar360 + fVar223;
          fVar384 = fVar338 * 0.0 * auVar427._0_4_;
          fVar386 = fVar353 * 0.0 * auVar427._4_4_;
          fVar410 = fVar412 * 0.0 * auVar427._8_4_;
          fVar411 = fVar382 * 0.0 * auVar427._12_4_;
          fVar413 = fVar361 - fVar447;
          fVar422 = fVar362 - fVar383;
          fVar424 = fVar363 - fVar387;
          fVar434 = fVar364 - fVar327;
          fVar222 = fVar444 + fVar384;
          fVar224 = fVar445 + fVar386;
          fVar225 = fVar148 + fVar410;
          fVar274 = fVar217 + fVar411;
          fVar443 = fVar365 - fVar268;
          fVar376 = fVar370 - fVar271;
          fVar385 = fVar374 - fVar322;
          fVar311 = fVar436 - fVar326;
          fVar338 = fVar269 - fVar420;
          fVar353 = fVar270 - fVar423;
          fVar412 = fVar272 - fVar344;
          fVar382 = fVar273 - fVar439;
          uVar139 = -(uint)(0.0 < (fVar443 * (fVar222 - fVar338) - fVar338 * (fVar437 - fVar443)) *
                                  0.0 + (fVar338 * (fVar342 - fVar413) -
                                        (fVar222 - fVar338) * fVar413) * 0.0 +
                                        ((fVar437 - fVar443) * fVar413 -
                                        (fVar342 - fVar413) * fVar443));
          uVar143 = -(uint)(0.0 < (fVar376 * (fVar224 - fVar353) - fVar353 * (fVar440 - fVar376)) *
                                  0.0 + (fVar353 * (fVar367 - fVar422) -
                                        (fVar224 - fVar353) * fVar422) * 0.0 +
                                        ((fVar440 - fVar376) * fVar422 -
                                        (fVar367 - fVar422) * fVar376));
          uVar142 = -(uint)(0.0 < (fVar385 * (fVar225 - fVar412) - fVar412 * (fVar441 - fVar385)) *
                                  0.0 + (fVar412 * (fVar372 - fVar424) -
                                        (fVar225 - fVar412) * fVar424) * 0.0 +
                                        ((fVar441 - fVar385) * fVar424 -
                                        (fVar372 - fVar424) * fVar385));
          uVar144 = -(uint)(0.0 < (fVar311 * (fVar274 - fVar382) - fVar382 * (fVar220 - fVar311)) *
                                  0.0 + (fVar382 * (fVar432 - fVar434) -
                                        (fVar274 - fVar382) * fVar434) * 0.0 +
                                        ((fVar220 - fVar311) * fVar434 -
                                        (fVar432 - fVar434) * fVar311));
          fVar324 = (float)((uint)(fVar391 - fVar324) & uVar139 |
                           ~uVar139 & (uint)(fVar361 + fVar447));
          fVar323 = (float)((uint)(fVar323 - fVar275) & uVar143 |
                           ~uVar143 & (uint)(fVar362 + fVar383));
          fVar325 = (float)((uint)(fVar325 - fVar390) & uVar142 |
                           ~uVar142 & (uint)(fVar363 + fVar387));
          fVar327 = (float)((uint)(fVar340 - fVar395) & uVar144 |
                           ~uVar144 & (uint)(fVar364 + fVar327));
          fVar363 = (float)((uint)(fVar343 - fVar421) & uVar139 |
                           ~uVar139 & (uint)(fVar365 + fVar268));
          fVar364 = (float)((uint)(fVar355 - fVar147) & uVar143 |
                           ~uVar143 & (uint)(fVar370 + fVar271));
          fVar365 = (float)((uint)(fVar356 - fVar219) & uVar142 |
                           ~uVar142 & (uint)(fVar374 + fVar322));
          fVar370 = (float)((uint)(fVar360 - fVar223) & uVar144 |
                           ~uVar144 & (uint)(fVar436 + fVar326));
          fVar268 = (float)((uint)(fVar444 - fVar384) & uVar139 |
                           ~uVar139 & (uint)(fVar269 + fVar420));
          fVar271 = (float)((uint)(fVar445 - fVar386) & uVar143 |
                           ~uVar143 & (uint)(fVar270 + fVar423));
          fVar322 = (float)((uint)(fVar148 - fVar410) & uVar142 |
                           ~uVar142 & (uint)(fVar272 + fVar344));
          fVar326 = (float)((uint)(fVar217 - fVar411) & uVar144 |
                           ~uVar144 & (uint)(fVar273 + fVar439));
          fVar420 = (float)((uint)fVar413 & uVar139 | ~uVar139 & (uint)fVar342);
          fVar423 = (float)((uint)fVar422 & uVar143 | ~uVar143 & (uint)fVar367);
          fVar344 = (float)((uint)fVar424 & uVar142 | ~uVar142 & (uint)fVar372);
          fVar439 = (float)((uint)fVar434 & uVar144 | ~uVar144 & (uint)fVar432);
          fVar447 = (float)((uint)fVar443 & uVar139 | ~uVar139 & (uint)fVar437);
          fVar383 = (float)((uint)fVar376 & uVar143 | ~uVar143 & (uint)fVar440);
          fVar387 = (float)((uint)fVar385 & uVar142 | ~uVar142 & (uint)fVar441);
          fVar391 = (float)((uint)fVar311 & uVar144 | ~uVar144 & (uint)fVar220);
          fVar384 = (float)((uint)fVar338 & uVar139 | ~uVar139 & (uint)fVar222);
          fVar386 = (float)((uint)fVar353 & uVar143 | ~uVar143 & (uint)fVar224);
          fVar410 = (float)((uint)fVar412 & uVar142 | ~uVar142 & (uint)fVar225);
          fVar411 = (float)((uint)fVar382 & uVar144 | ~uVar144 & (uint)fVar274);
          fVar413 = (float)((uint)fVar342 & uVar139 | ~uVar139 & (uint)fVar413) - fVar324;
          fVar422 = (float)((uint)fVar367 & uVar143 | ~uVar143 & (uint)fVar422) - fVar323;
          fVar424 = (float)((uint)fVar372 & uVar142 | ~uVar142 & (uint)fVar424) - fVar325;
          fVar434 = (float)((uint)fVar432 & uVar144 | ~uVar144 & (uint)fVar434) - fVar327;
          fVar443 = (float)((uint)fVar437 & uVar139 | ~uVar139 & (uint)fVar443) - fVar363;
          fVar376 = (float)((uint)fVar440 & uVar143 | ~uVar143 & (uint)fVar376) - fVar364;
          fVar385 = (float)((uint)fVar441 & uVar142 | ~uVar142 & (uint)fVar385) - fVar365;
          fVar311 = (float)((uint)fVar220 & uVar144 | ~uVar144 & (uint)fVar311) - fVar370;
          fVar340 = (float)((uint)fVar222 & uVar139 | ~uVar139 & (uint)fVar338) - fVar268;
          fVar342 = (float)((uint)fVar224 & uVar143 | ~uVar143 & (uint)fVar353) - fVar271;
          fVar343 = (float)((uint)fVar225 & uVar142 | ~uVar142 & (uint)fVar412) - fVar322;
          fVar355 = (float)((uint)fVar274 & uVar144 | ~uVar144 & (uint)fVar382) - fVar326;
          fVar367 = fVar324 - fVar420;
          fVar372 = fVar323 - fVar423;
          fVar374 = fVar325 - fVar344;
          fVar432 = fVar327 - fVar439;
          fVar421 = fVar363 - fVar447;
          fVar147 = fVar364 - fVar383;
          fVar219 = fVar365 - fVar387;
          fVar223 = fVar370 - fVar391;
          fVar338 = fVar268 - fVar384;
          fVar353 = fVar271 - fVar386;
          fVar412 = fVar322 - fVar410;
          fVar382 = fVar326 - fVar411;
          fVar356 = (fVar363 * fVar340 - fVar268 * fVar443) * 0.0 +
                    (fVar268 * fVar413 - fVar324 * fVar340) * 0.0 +
                    (fVar324 * fVar443 - fVar363 * fVar413);
          fVar360 = (fVar364 * fVar342 - fVar271 * fVar376) * 0.0 +
                    (fVar271 * fVar422 - fVar323 * fVar342) * 0.0 +
                    (fVar323 * fVar376 - fVar364 * fVar422);
          auVar317._4_4_ = fVar360;
          auVar317._0_4_ = fVar356;
          fVar361 = (fVar365 * fVar343 - fVar322 * fVar385) * 0.0 +
                    (fVar322 * fVar424 - fVar325 * fVar343) * 0.0 +
                    (fVar325 * fVar385 - fVar365 * fVar424);
          fVar362 = (fVar370 * fVar355 - fVar326 * fVar311) * 0.0 +
                    (fVar326 * fVar434 - fVar327 * fVar355) * 0.0 +
                    (fVar327 * fVar311 - fVar370 * fVar434);
          auVar428._0_4_ =
               (fVar447 * fVar338 - fVar384 * fVar421) * 0.0 +
               (fVar384 * fVar367 - fVar420 * fVar338) * 0.0 +
               (fVar420 * fVar421 - fVar447 * fVar367);
          auVar428._4_4_ =
               (fVar383 * fVar353 - fVar386 * fVar147) * 0.0 +
               (fVar386 * fVar372 - fVar423 * fVar353) * 0.0 +
               (fVar423 * fVar147 - fVar383 * fVar372);
          auVar428._8_4_ =
               (fVar387 * fVar412 - fVar410 * fVar219) * 0.0 +
               (fVar410 * fVar374 - fVar344 * fVar412) * 0.0 +
               (fVar344 * fVar219 - fVar387 * fVar374);
          auVar428._12_4_ =
               (fVar391 * fVar382 - fVar411 * fVar223) * 0.0 +
               (fVar411 * fVar432 - fVar439 * fVar382) * 0.0 +
               (fVar439 * fVar223 - fVar391 * fVar432);
          auVar317._8_4_ = fVar361;
          auVar317._12_4_ = fVar362;
          auVar175 = maxps(auVar317,auVar428);
          bVar89 = auVar175._0_4_ <= 0.0 && bVar89;
          auVar318._0_4_ = -(uint)bVar89;
          bVar90 = auVar175._4_4_ <= 0.0 && bVar90;
          auVar318._4_4_ = -(uint)bVar90;
          bVar91 = auVar175._8_4_ <= 0.0 && bVar91;
          auVar318._8_4_ = -(uint)bVar91;
          bVar92 = auVar175._12_4_ <= 0.0 && bVar92;
          auVar318._12_4_ = -(uint)bVar92;
          iVar212 = movmskps((int)(bezier_basis1 + lVar134),auVar318);
          if (iVar212 == 0) {
LAB_00367470:
            auVar303._8_8_ = uStack_3d0;
            auVar303._0_8_ = local_3d8;
          }
          else {
            fVar386 = fVar421 * fVar340 - fVar338 * fVar443;
            fVar410 = fVar147 * fVar342 - fVar353 * fVar376;
            fVar411 = fVar219 * fVar343 - fVar412 * fVar385;
            fVar420 = fVar223 * fVar355 - fVar382 * fVar311;
            fVar384 = fVar338 * fVar413 - fVar340 * fVar367;
            fVar353 = fVar353 * fVar422 - fVar342 * fVar372;
            fVar412 = fVar412 * fVar424 - fVar343 * fVar374;
            fVar382 = fVar382 * fVar434 - fVar355 * fVar432;
            fVar421 = fVar367 * fVar443 - fVar421 * fVar413;
            fVar413 = fVar372 * fVar376 - fVar147 * fVar422;
            fVar422 = fVar374 * fVar385 - fVar219 * fVar424;
            fVar423 = fVar432 * fVar311 - fVar223 * fVar434;
            auVar302._0_4_ = fVar384 * 0.0 + fVar421;
            auVar302._4_4_ = fVar353 * 0.0 + fVar413;
            auVar302._8_4_ = fVar412 * 0.0 + fVar422;
            auVar302._12_4_ = fVar382 * 0.0 + fVar423;
            auVar358._0_4_ = fVar386 * 0.0 + auVar302._0_4_;
            auVar358._4_4_ = fVar410 * 0.0 + auVar302._4_4_;
            auVar358._8_4_ = fVar411 * 0.0 + auVar302._8_4_;
            auVar358._12_4_ = fVar420 * 0.0 + auVar302._12_4_;
            auVar175 = rcpps(auVar302,auVar358);
            fVar147 = auVar175._0_4_;
            fVar219 = auVar175._4_4_;
            fVar223 = auVar175._8_4_;
            fVar338 = auVar175._12_4_;
            fVar147 = (1.0 - auVar358._0_4_ * fVar147) * fVar147 + fVar147;
            fVar219 = (1.0 - auVar358._4_4_ * fVar219) * fVar219 + fVar219;
            fVar223 = (1.0 - auVar358._8_4_ * fVar223) * fVar223 + fVar223;
            fVar338 = (1.0 - auVar358._12_4_ * fVar338) * fVar338 + fVar338;
            fVar268 = (fVar268 * fVar421 + fVar363 * fVar384 + fVar324 * fVar386) * fVar147;
            fVar271 = (fVar271 * fVar413 + fVar364 * fVar353 + fVar323 * fVar410) * fVar219;
            fVar322 = (fVar322 * fVar422 + fVar365 * fVar412 + fVar325 * fVar411) * fVar223;
            fVar326 = (fVar326 * fVar423 + fVar370 * fVar382 + fVar327 * fVar420) * fVar338;
            fVar421 = *(float *)(ray + k * 4 + 0x80);
            bVar89 = ((float)local_398._0_4_ <= fVar268 && fVar268 <= fVar421) && bVar89;
            auVar336._0_4_ = -(uint)bVar89;
            bVar90 = ((float)local_398._4_4_ <= fVar271 && fVar271 <= fVar421) && bVar90;
            auVar336._4_4_ = -(uint)bVar90;
            bVar91 = (fStack_390 <= fVar322 && fVar322 <= fVar421) && bVar91;
            auVar336._8_4_ = -(uint)bVar91;
            bVar92 = (fStack_38c <= fVar326 && fVar326 <= fVar421) && bVar92;
            auVar336._12_4_ = -(uint)bVar92;
            iVar212 = movmskps(iVar212,auVar336);
            if (iVar212 == 0) goto LAB_00367470;
            auVar337._0_8_ =
                 CONCAT44(-(uint)(auVar358._4_4_ != 0.0 && bVar90),
                          -(uint)(auVar358._0_4_ != 0.0 && bVar89));
            auVar337._8_4_ = -(uint)(auVar358._8_4_ != 0.0 && bVar91);
            auVar337._12_4_ = -(uint)(auVar358._12_4_ != 0.0 && bVar92);
            iVar212 = movmskps(iVar212,auVar337);
            auVar303._8_8_ = uStack_3d0;
            auVar303._0_8_ = local_3d8;
            if (iVar212 != 0) {
              fVar356 = fVar356 * fVar147;
              fVar360 = fVar360 * fVar219;
              fVar361 = fVar361 * fVar223;
              fVar362 = fVar362 * fVar338;
              local_468 = (float)((uint)(1.0 - fVar356) & uVar139 | ~uVar139 & (uint)fVar356);
              fStack_464 = (float)((uint)(1.0 - fVar360) & uVar143 | ~uVar143 & (uint)fVar360);
              fStack_460 = (float)((uint)(1.0 - fVar361) & uVar142 | ~uVar142 & (uint)fVar361);
              fStack_45c = (float)((uint)(1.0 - fVar362) & uVar144 | ~uVar144 & (uint)fVar362);
              local_288 = (float)(~uVar139 & (uint)(auVar428._0_4_ * fVar147) |
                                 (uint)(1.0 - auVar428._0_4_ * fVar147) & uVar139);
              fStack_284 = (float)(~uVar143 & (uint)(auVar428._4_4_ * fVar219) |
                                  (uint)(1.0 - auVar428._4_4_ * fVar219) & uVar143);
              fStack_280 = (float)(~uVar142 & (uint)(auVar428._8_4_ * fVar223) |
                                  (uint)(1.0 - auVar428._8_4_ * fVar223) & uVar142);
              fStack_27c = (float)(~uVar144 & (uint)(auVar428._12_4_ * fVar338) |
                                  (uint)(1.0 - auVar428._12_4_ * fVar338) & uVar144);
              auVar303._8_4_ = auVar337._8_4_;
              auVar303._0_8_ = auVar337._0_8_;
              auVar303._12_4_ = auVar337._12_4_;
              local_358 = fVar268;
              fStack_354 = fVar271;
              fStack_350 = fVar322;
              fStack_34c = fVar326;
            }
          }
          iVar212 = movmskps(iVar212,auVar303);
          if (iVar212 != 0) {
            fVar147 = (auVar427._0_4_ - auVar254._0_4_) * local_468 + auVar254._0_4_;
            fVar219 = (auVar427._4_4_ - auVar254._4_4_) * fStack_464 + auVar254._4_4_;
            fVar223 = (auVar427._8_4_ - auVar254._8_4_) * fStack_460 + auVar254._8_4_;
            fVar268 = (auVar427._12_4_ - auVar254._12_4_) * fStack_45c + auVar254._12_4_;
            fVar421 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            aVar204._0_4_ = -(uint)(fVar421 * (fVar147 + fVar147) < local_358) & auVar303._0_4_;
            aVar204._4_4_ = -(uint)(fVar421 * (fVar219 + fVar219) < fStack_354) & auVar303._4_4_;
            aVar204._8_4_ = -(uint)(fVar421 * (fVar223 + fVar223) < fStack_350) & auVar303._8_4_;
            aVar204._12_4_ = -(uint)(fVar421 * (fVar268 + fVar268) < fStack_34c) & auVar303._12_4_;
            iVar212 = movmskps((int)pre,(undefined1  [16])aVar204);
            if (iVar212 != 0) {
              local_288 = local_288 + local_288 + -1.0;
              fStack_284 = fStack_284 + fStack_284 + -1.0;
              fStack_280 = fStack_280 + fStack_280 + -1.0;
              fStack_27c = fStack_27c + fStack_27c + -1.0;
              bhit.U.field_0.v[1] = fStack_464;
              bhit.U.field_0.v[0] = local_468;
              bhit.U.field_0.v[2] = fStack_460;
              bhit.U.field_0.v[3] = fStack_45c;
              bhit.T.field_0.v[1] = fStack_354;
              bhit.T.field_0.v[0] = local_358;
              bhit.T.field_0.v[2] = fStack_350;
              bhit.T.field_0.v[3] = fStack_34c;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar345,fVar339);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar359,fVar354);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_3a4,local_3a8);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_39c,fStack_3a0);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_3b4,local_3b8);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_3ac,fStack_3b0);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_3c4,local_3c8);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_3bc,fStack_3c0);
              pGVar133 = (context->scene->geometries).items[(long)local_3e0].ptr;
              pRVar132 = local_3e0;
              bhit.V.field_0.v[0] = local_288;
              bhit.V.field_0.v[1] = fStack_284;
              bhit.V.field_0.v[2] = fStack_280;
              bhit.V.field_0.v[3] = fStack_27c;
              bhit.i = uVar141;
              bhit.N = iVar309;
              bhit.valid.field_0 = aVar204;
              if ((pGVar133->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar421 = (float)(int)uVar141;
                bhit.vu.field_0.v[0] = (fVar421 + local_468 + 0.0) * local_78;
                bhit.vu.field_0.v[1] = (fVar421 + fStack_464 + 1.0) * fStack_74;
                bhit.vu.field_0.v[2] = (fVar421 + fStack_460 + 2.0) * fStack_70;
                bhit.vu.field_0.v[3] = (fVar421 + fStack_45c + 3.0) * fStack_6c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
                bhit.vt.field_0.v[1] = fStack_354;
                bhit.vt.field_0.v[0] = local_358;
                bhit.vt.field_0.v[2] = fStack_350;
                bhit.vt.field_0.v[3] = fStack_34c;
                auVar255._0_4_ = aVar204._0_4_ & (uint)local_358;
                auVar255._4_4_ = aVar204._4_4_ & (uint)fStack_354;
                auVar255._8_4_ = aVar204._8_4_ & (uint)fStack_350;
                auVar255._12_4_ = aVar204._12_4_ & (uint)fStack_34c;
                auVar304._0_8_ = CONCAT44(~aVar204._4_4_,~aVar204._0_4_) & 0x7f8000007f800000;
                auVar304._8_4_ = ~aVar204._8_4_ & 0x7f800000;
                auVar304._12_4_ = ~aVar204._12_4_ & 0x7f800000;
                auVar304 = auVar304 | auVar255;
                auVar319._4_4_ = auVar304._0_4_;
                auVar319._0_4_ = auVar304._4_4_;
                auVar319._8_4_ = auVar304._12_4_;
                auVar319._12_4_ = auVar304._8_4_;
                auVar175 = minps(auVar319,auVar304);
                auVar256._0_8_ = auVar175._8_8_;
                auVar256._8_4_ = auVar175._0_4_;
                auVar256._12_4_ = auVar175._4_4_;
                auVar175 = minps(auVar256,auVar175);
                auVar257._0_8_ =
                     CONCAT44(-(uint)(auVar175._4_4_ == auVar304._4_4_) & aVar204._4_4_,
                              -(uint)(auVar175._0_4_ == auVar304._0_4_) & aVar204._0_4_);
                auVar257._8_4_ = -(uint)(auVar175._8_4_ == auVar304._8_4_) & aVar204._8_4_;
                auVar257._12_4_ = -(uint)(auVar175._12_4_ == auVar304._12_4_) & aVar204._12_4_;
                iVar212 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar257);
                aVar205 = aVar204;
                if (iVar212 != 0) {
                  aVar205.i[2] = auVar257._8_4_;
                  aVar205._0_8_ = auVar257._0_8_;
                  aVar205.i[3] = auVar257._12_4_;
                }
                uVar139 = movmskps(iVar212,(undefined1  [16])aVar205);
                lVar137 = 0;
                if (uVar139 != 0) {
                  for (; (uVar139 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
                  }
                }
                valid.field_0 = aVar204;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar133->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar421 = bhit.vu.field_0.v[lVar137];
                  fVar147 = bhit.vv.field_0.v[lVar137];
                  fVar219 = 1.0 - fVar421;
                  fVar268 = fVar421 * fVar219 + fVar421 * fVar219;
                  fVar223 = fVar219 * fVar219 * -3.0;
                  fVar271 = (fVar219 * fVar219 - fVar268) * 3.0;
                  fVar219 = (fVar268 - fVar421 * fVar421) * 3.0;
                  fVar268 = fVar421 * fVar421 * 3.0;
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar137];
                  *(float *)(ray + k * 4 + 0xc0) =
                       fVar223 * fVar339 +
                       fVar271 * local_3a8 + fVar219 * local_3b8 + fVar268 * local_3c8;
                  *(float *)(ray + k * 4 + 0xd0) =
                       fVar223 * fVar345 +
                       fVar271 * fStack_3a4 + fVar219 * fStack_3b4 + fVar268 * fStack_3c4;
                  *(float *)(ray + k * 4 + 0xe0) =
                       fVar223 * fVar354 +
                       fVar271 * fStack_3a0 + fVar219 * fStack_3b0 + fVar268 * fStack_3c0;
                  *(float *)(ray + k * 4 + 0xf0) = fVar421;
                  *(float *)(ray + k * 4 + 0x100) = fVar147;
                  *(uint *)(ray + k * 4 + 0x110) = uVar140;
                  *(int *)(ray + k * 4 + 0x120) = (int)local_3e0;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  pRVar132 = (RTCIntersectArguments *)context;
                }
                else {
                  auVar62 = *(undefined1 (*) [12])*(undefined1 (*) [16])(mm_lookupmask_ps + lVar131)
                  ;
                  uStack_4ac = (undefined4)
                               ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar131 + 8) >> 0x20);
                  _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  while( true ) {
                    local_d8 = bhit.vu.field_0.v[lVar137];
                    local_c8 = bhit.vv.field_0.v[lVar137];
                    *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar137];
                    fVar421 = 1.0 - local_d8;
                    fVar219 = local_d8 * fVar421 + local_d8 * fVar421;
                    fVar223 = (fVar219 - local_d8 * local_d8) * 3.0;
                    fVar147 = local_d8 * local_d8 * 3.0;
                    fVar219 = (fVar421 * fVar421 - fVar219) * 3.0;
                    args.context = context->user;
                    fVar421 = fVar421 * fVar421 * -3.0;
                    local_108 = fVar421 * fVar339 +
                                fVar219 * local_3a8 + fVar223 * local_3b8 + fVar147 * local_3c8;
                    local_f8 = fVar421 * fVar345 +
                               fVar219 * fStack_3a4 + fVar223 * fStack_3b4 + fVar147 * fStack_3c4;
                    local_e8 = fVar421 * fVar354 +
                               fVar219 * fStack_3a0 + fVar223 * fStack_3b0 + fVar147 * fStack_3c0;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    local_b8 = local_2e8;
                    uStack_b0 = uStack_2e0;
                    local_a8 = CONCAT44(uStack_64,local_68);
                    uStack_a0 = CONCAT44(uStack_5c,uStack_60);
                    local_98 = (args.context)->instID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_88 = (args.context)->instPrimID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_3f8._12_4_ = uStack_4ac;
                    local_3f8._0_12_ = auVar62;
                    args.valid = (int *)local_3f8;
                    pRVar132 = (RTCIntersectArguments *)pGVar133->userPtr;
                    args.hit = (RTCHitN *)&local_108;
                    args.N = 4;
                    p_Var127 = pGVar133->intersectionFilterN;
                    args.geometryUserPtr = pRVar132;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var127 != (RTCFilterFunctionN)0x0) {
                      p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
                    }
                    auVar258._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                    auVar258._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                    auVar258._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                    auVar258._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                    uVar139 = movmskps((int)p_Var127,auVar258);
                    pRVar128 = (RTCRayN *)(ulong)(uVar139 ^ 0xf);
                    if ((uVar139 ^ 0xf) == 0) {
                      auVar258 = auVar258 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar132 = context->args;
                      pRVar129 = (RTCIntersectArguments *)pRVar132->filter;
                      if ((pRVar129 != (RTCIntersectArguments *)0x0) &&
                         ((((ulong)*(Scene **)&pRVar132->flags & 2) != 0 ||
                          (((pGVar133->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar129 = (RTCIntersectArguments *)(*(code *)pRVar129)(&args);
                      }
                      auVar206._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                      auVar206._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                      auVar206._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                      auVar206._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                      auVar258 = auVar206 ^ _DAT_01f46b70;
                      uVar139 = movmskps((int)pRVar129,auVar206);
                      pRVar128 = (RTCRayN *)(ulong)(uVar139 ^ 0xf);
                      if ((uVar139 ^ 0xf) != 0) {
                        uVar139 = *(uint *)(args.hit + 4);
                        uVar141 = *(uint *)(args.hit + 8);
                        uVar143 = *(uint *)(args.hit + 0xc);
                        *(uint *)(args.ray + 0xc0) =
                             ~auVar206._0_4_ & *(uint *)args.hit |
                             *(uint *)(args.ray + 0xc0) & auVar206._0_4_;
                        *(uint *)(args.ray + 0xc4) =
                             ~auVar206._4_4_ & uVar139 | *(uint *)(args.ray + 0xc4) & auVar206._4_4_
                        ;
                        *(uint *)(args.ray + 200) =
                             ~auVar206._8_4_ & uVar141 | *(uint *)(args.ray + 200) & auVar206._8_4_;
                        *(uint *)(args.ray + 0xcc) =
                             ~auVar206._12_4_ & uVar143 |
                             *(uint *)(args.ray + 0xcc) & auVar206._12_4_;
                        uVar139 = *(uint *)(args.hit + 0x14);
                        uVar141 = *(uint *)(args.hit + 0x18);
                        uVar143 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar206._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar206._4_4_ & uVar139 | *(uint *)(args.ray + 0xd4) & auVar206._4_4_
                        ;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar206._8_4_ & uVar141 | *(uint *)(args.ray + 0xd8) & auVar206._8_4_
                        ;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar206._12_4_ & uVar143 |
                             *(uint *)(args.ray + 0xdc) & auVar206._12_4_;
                        uVar139 = *(uint *)(args.hit + 0x24);
                        uVar141 = *(uint *)(args.hit + 0x28);
                        uVar143 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar206._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar206._4_4_ & uVar139 | *(uint *)(args.ray + 0xe4) & auVar206._4_4_
                        ;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar206._8_4_ & uVar141 | *(uint *)(args.ray + 0xe8) & auVar206._8_4_
                        ;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar206._12_4_ & uVar143 |
                             *(uint *)(args.ray + 0xec) & auVar206._12_4_;
                        uVar139 = *(uint *)(args.hit + 0x34);
                        uVar141 = *(uint *)(args.hit + 0x38);
                        uVar143 = *(uint *)(args.hit + 0x3c);
                        *(uint *)(args.ray + 0xf0) =
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x30) |
                             *(uint *)(args.ray + 0xf0) & auVar206._0_4_;
                        *(uint *)(args.ray + 0xf4) =
                             ~auVar206._4_4_ & uVar139 | *(uint *)(args.ray + 0xf4) & auVar206._4_4_
                        ;
                        *(uint *)(args.ray + 0xf8) =
                             ~auVar206._8_4_ & uVar141 | *(uint *)(args.ray + 0xf8) & auVar206._8_4_
                        ;
                        *(uint *)(args.ray + 0xfc) =
                             ~auVar206._12_4_ & uVar143 |
                             *(uint *)(args.ray + 0xfc) & auVar206._12_4_;
                        uVar139 = *(uint *)(args.hit + 0x44);
                        uVar141 = *(uint *)(args.hit + 0x48);
                        uVar143 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar206._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar206._4_4_ & uVar139 |
                             *(uint *)(args.ray + 0x104) & auVar206._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar206._8_4_ & uVar141 |
                             *(uint *)(args.ray + 0x108) & auVar206._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar206._12_4_ & uVar143 |
                             *(uint *)(args.ray + 0x10c) & auVar206._12_4_;
                        uVar139 = *(uint *)(args.hit + 0x54);
                        uVar141 = *(uint *)(args.hit + 0x58);
                        uVar143 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar206._0_4_ |
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar206._4_4_ |
                             ~auVar206._4_4_ & uVar139;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar206._8_4_ |
                             ~auVar206._8_4_ & uVar141;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar206._12_4_ |
                             ~auVar206._12_4_ & uVar143;
                        uVar139 = *(uint *)(args.hit + 100);
                        uVar141 = *(uint *)(args.hit + 0x68);
                        uVar143 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar206._0_4_ |
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar206._4_4_ |
                             ~auVar206._4_4_ & uVar139;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar206._8_4_ |
                             ~auVar206._8_4_ & uVar141;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar206._12_4_ |
                             ~auVar206._12_4_ & uVar143;
                        uVar139 = *(uint *)(args.hit + 0x74);
                        uVar141 = *(uint *)(args.hit + 0x78);
                        uVar143 = *(uint *)(args.hit + 0x7c);
                        *(uint *)(args.ray + 0x130) =
                             ~auVar206._0_4_ & *(uint *)(args.hit + 0x70) |
                             *(uint *)(args.ray + 0x130) & auVar206._0_4_;
                        *(uint *)(args.ray + 0x134) =
                             ~auVar206._4_4_ & uVar139 |
                             *(uint *)(args.ray + 0x134) & auVar206._4_4_;
                        *(uint *)(args.ray + 0x138) =
                             ~auVar206._8_4_ & uVar141 |
                             *(uint *)(args.ray + 0x138) & auVar206._8_4_;
                        *(uint *)(args.ray + 0x13c) =
                             ~auVar206._12_4_ & uVar143 |
                             *(uint *)(args.ray + 0x13c) & auVar206._12_4_;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar206 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar206;
                        pRVar128 = args.ray;
                        pRVar132 = (RTCIntersectArguments *)args.hit;
                      }
                    }
                    auVar259._0_4_ = auVar258._0_4_ << 0x1f;
                    auVar259._4_4_ = auVar258._4_4_ << 0x1f;
                    auVar259._8_4_ = auVar258._8_4_ << 0x1f;
                    auVar259._12_4_ = auVar258._12_4_ << 0x1f;
                    iVar212 = movmskps((int)pRVar128,auVar259);
                    if (iVar212 == 0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                    }
                    else {
                      local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_518._4_4_ = 0;
                      fStack_510 = 0.0;
                      uStack_50c = 0;
                    }
                    *(undefined4 *)(local_3f8 + lVar137 * 4 + -0x10) = 0;
                    valid.field_0.i[0] =
                         -(uint)(local_358 <= (float)local_518._0_4_) & valid.field_0.i[0];
                    valid.field_0.i[1] =
                         -(uint)(fStack_354 <= (float)local_518._0_4_) & valid.field_0.i[1];
                    valid.field_0.i[2] =
                         -(uint)(fStack_350 <= (float)local_518._0_4_) & valid.field_0.i[2];
                    valid.field_0.i[3] =
                         -(uint)(fStack_34c <= (float)local_518._0_4_) & valid.field_0.i[3];
                    iVar212 = movmskps(iVar212,(undefined1  [16])valid.field_0);
                    if (iVar212 == 0) break;
                    auVar260._0_4_ = valid.field_0.i[0] & (uint)local_358;
                    auVar260._4_4_ = valid.field_0.i[1] & (uint)fStack_354;
                    auVar260._8_4_ = valid.field_0.i[2] & (uint)fStack_350;
                    auVar260._12_4_ = valid.field_0.i[3] & (uint)fStack_34c;
                    auVar305._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar305._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar305._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar305 = auVar305 | auVar260;
                    auVar320._4_4_ = auVar305._0_4_;
                    auVar320._0_4_ = auVar305._4_4_;
                    auVar320._8_4_ = auVar305._12_4_;
                    auVar320._12_4_ = auVar305._8_4_;
                    auVar175 = minps(auVar320,auVar305);
                    auVar261._0_8_ = auVar175._8_8_;
                    auVar261._8_4_ = auVar175._0_4_;
                    auVar261._12_4_ = auVar175._4_4_;
                    auVar175 = minps(auVar261,auVar175);
                    auVar262._0_8_ =
                         CONCAT44(-(uint)(auVar175._4_4_ == auVar305._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar175._0_4_ == auVar305._0_4_) & valid.field_0.i[0]);
                    auVar262._8_4_ = -(uint)(auVar175._8_4_ == auVar305._8_4_) & valid.field_0.i[2];
                    auVar262._12_4_ =
                         -(uint)(auVar175._12_4_ == auVar305._12_4_) & valid.field_0.i[3];
                    iVar212 = movmskps(iVar212,auVar262);
                    aVar207 = valid.field_0;
                    if (iVar212 != 0) {
                      aVar207.i[2] = auVar262._8_4_;
                      aVar207._0_8_ = auVar262._0_8_;
                      aVar207.i[3] = auVar262._12_4_;
                    }
                    uVar135 = movmskps(iVar212,(undefined1  [16])aVar207);
                    uVar130 = CONCAT44((int)((ulong)pRVar128 >> 0x20),uVar135);
                    lVar137 = 0;
                    if (uVar130 != 0) {
                      for (; (uVar130 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fVar421 = *(float *)(ray + k * 4 + 0x80);
    auVar253._4_4_ = -(uint)(fStack_44 <= fVar421);
    auVar253._0_4_ = -(uint)(local_48 <= fVar421);
    auVar253._8_4_ = -(uint)(fStack_40 <= fVar421);
    auVar253._12_4_ = -(uint)(fStack_3c <= fVar421);
    uVar139 = movmskps(uVar135,auVar253);
    uVar136 = (ulong)((uint)uVar136 & (uint)uVar136 + 0xf & uVar139);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }